

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCRayQueryContext *pRVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  long lVar88;
  long lVar89;
  undefined4 uVar90;
  undefined8 unaff_R13;
  uint uVar91;
  bool bVar92;
  vint4 ai;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar100 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar119;
  float fVar144;
  float fVar145;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar146;
  float fVar149;
  float fVar151;
  float fVar152;
  undefined1 auVar133 [32];
  float fVar147;
  undefined1 auVar134 [32];
  float fVar148;
  float fVar150;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar173;
  float fVar175;
  vint4 bi_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar174;
  float fVar177;
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar183;
  undefined1 auVar165 [32];
  float fVar176;
  float fVar179;
  float fVar182;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar164 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  vint4 bi;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar223;
  float fVar224;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar226;
  float fVar227;
  undefined1 auVar216 [28];
  undefined1 auVar217 [32];
  float fVar225;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar228;
  float fVar245;
  float fVar246;
  vint4 ai_1;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [28];
  float fVar248;
  float fVar249;
  undefined1 auVar237 [32];
  float fVar247;
  float fVar250;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar251;
  float fVar252;
  float fVar260;
  float fVar262;
  vint4 bi_1;
  undefined1 auVar253 [16];
  float fVar264;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar261;
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar257 [28];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar277;
  vint4 ai_2;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [28];
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar287;
  float fVar294;
  float fVar295;
  undefined1 auVar288 [16];
  float fVar296;
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [64];
  float s;
  float fVar303;
  float fVar305;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar297;
  float fVar298;
  float fVar304;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar319;
  float fVar326;
  float fVar328;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float fVar320;
  undefined1 auVar324 [16];
  float fVar327;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  undefined1 auVar325 [64];
  float fVar336;
  float fVar346;
  float fVar347;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar348;
  float fVar352;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar345 [64];
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar361;
  float fVar364;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar362;
  float fVar363;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  float fVar380;
  float fVar383;
  float fVar384;
  undefined1 auVar381 [16];
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  undefined1 auVar382 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  float fVar391;
  float fVar392;
  float fVar394;
  float fVar395;
  float fVar396;
  undefined1 auVar393 [16];
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d24;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float local_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined1 local_c60 [8];
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  RTCFilterFunctionNArguments local_b28;
  undefined1 (*local_af8) [16];
  undefined1 (*local_af0) [16];
  undefined1 (*local_ae8) [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 auStack_ab0 [16];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  Primitive *local_9a8;
  ulong local_9a0;
  undefined1 auStack_998 [24];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  RTCHitN local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  uint local_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  uint uStack_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  uint local_6a0;
  uint uStack_69c;
  uint uStack_698;
  uint uStack_694;
  uint uStack_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar8 = prim[1];
  uVar83 = (ulong)(byte)PVar8;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  lVar89 = uVar83 * 0x25;
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x11 + 6)));
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  auVar121 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar121 = vinsertps_avx(auVar121,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar121 = vsubps_avx(auVar121,*(undefined1 (*) [16])(prim + lVar89 + 6));
  fVar319 = *(float *)(prim + lVar89 + 0x12);
  auVar204._0_4_ = fVar319 * auVar121._0_4_;
  auVar204._4_4_ = fVar319 * auVar121._4_4_;
  auVar204._8_4_ = fVar319 * auVar121._8_4_;
  auVar204._12_4_ = fVar319 * auVar121._12_4_;
  auVar321._0_4_ = fVar319 * auVar15._0_4_;
  auVar321._4_4_ = fVar319 * auVar15._4_4_;
  auVar321._8_4_ = fVar319 * auVar15._8_4_;
  auVar321._12_4_ = fVar319 * auVar15._12_4_;
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar15 = vshufps_avx(auVar321,auVar321,0x55);
  auVar207 = vshufps_avx(auVar321,auVar321,0xaa);
  fVar251 = auVar207._0_4_;
  fVar260 = auVar207._4_4_;
  fVar262 = auVar207._8_4_;
  fVar264 = auVar207._12_4_;
  fVar146 = auVar15._0_4_;
  fVar154 = auVar15._4_4_;
  fVar174 = auVar15._8_4_;
  fVar149 = auVar15._12_4_;
  auVar207 = vcvtdq2ps_avx(auVar17);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar122 = vcvtdq2ps_avx(auVar121);
  auVar121 = vshufps_avx(auVar321,auVar321,0);
  fVar319 = auVar121._0_4_;
  fVar326 = auVar121._4_4_;
  fVar328 = auVar121._8_4_;
  fVar330 = auVar121._12_4_;
  auVar288._0_4_ = fVar319 * auVar207._0_4_ + fVar146 * auVar18._0_4_ + fVar251 * auVar19._0_4_;
  auVar288._4_4_ = fVar326 * auVar207._4_4_ + fVar154 * auVar18._4_4_ + fVar260 * auVar19._4_4_;
  auVar288._8_4_ = fVar328 * auVar207._8_4_ + fVar174 * auVar18._8_4_ + fVar262 * auVar19._8_4_;
  auVar288._12_4_ = fVar330 * auVar207._12_4_ + fVar149 * auVar18._12_4_ + fVar264 * auVar19._12_4_;
  auVar100._0_4_ = fVar319 * auVar189._0_4_ + fVar146 * auVar20._0_4_ + fVar251 * auVar192._0_4_;
  auVar100._4_4_ = fVar326 * auVar189._4_4_ + fVar154 * auVar20._4_4_ + fVar260 * auVar192._4_4_;
  auVar100._8_4_ = fVar328 * auVar189._8_4_ + fVar174 * auVar20._8_4_ + fVar262 * auVar192._8_4_;
  auVar100._12_4_ = fVar330 * auVar189._12_4_ + fVar149 * auVar20._12_4_ + fVar264 * auVar192._12_4_
  ;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar93 = vpmovsxwd_avx(auVar121);
  auVar121 = vcvtdq2ps_avx(auVar123);
  auVar322._0_4_ = fVar146 * auVar98._0_4_ + fVar251 * auVar122._0_4_ + fVar319 * auVar121._0_4_;
  auVar322._4_4_ = fVar154 * auVar98._4_4_ + fVar260 * auVar122._4_4_ + fVar326 * auVar121._4_4_;
  auVar322._8_4_ = fVar174 * auVar98._8_4_ + fVar262 * auVar122._8_4_ + fVar328 * auVar121._8_4_;
  auVar322._12_4_ = fVar149 * auVar98._12_4_ + fVar264 * auVar122._12_4_ + fVar330 * auVar121._12_4_
  ;
  auVar15 = vshufps_avx(auVar204,auVar204,0xaa);
  fVar251 = auVar15._0_4_;
  fVar260 = auVar15._4_4_;
  fVar262 = auVar15._8_4_;
  fVar264 = auVar15._12_4_;
  auVar15 = vshufps_avx(auVar204,auVar204,0x55);
  fVar319 = auVar15._0_4_;
  fVar328 = auVar15._4_4_;
  fVar146 = auVar15._8_4_;
  fVar174 = auVar15._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar123 = vpmovsxwd_avx(auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar94 = vpmovsxwd_avx(auVar17);
  auVar15 = vshufps_avx(auVar204,auVar204,0);
  fVar326 = auVar15._0_4_;
  fVar330 = auVar15._4_4_;
  fVar154 = auVar15._8_4_;
  fVar149 = auVar15._12_4_;
  auVar299._0_4_ = auVar207._0_4_ * fVar326 + auVar18._0_4_ * fVar319 + fVar251 * auVar19._0_4_;
  auVar299._4_4_ = auVar207._4_4_ * fVar330 + auVar18._4_4_ * fVar328 + fVar260 * auVar19._4_4_;
  auVar299._8_4_ = auVar207._8_4_ * fVar154 + auVar18._8_4_ * fVar146 + fVar262 * auVar19._8_4_;
  auVar299._12_4_ = auVar207._12_4_ * fVar149 + auVar18._12_4_ * fVar174 + fVar264 * auVar19._12_4_;
  auVar269._0_4_ = auVar192._0_4_ * fVar251 + auVar20._0_4_ * fVar319 + fVar326 * auVar189._0_4_;
  auVar269._4_4_ = auVar192._4_4_ * fVar260 + auVar20._4_4_ * fVar328 + fVar330 * auVar189._4_4_;
  auVar269._8_4_ = auVar192._8_4_ * fVar262 + auVar20._8_4_ * fVar146 + fVar154 * auVar189._8_4_;
  auVar269._12_4_ = auVar192._12_4_ * fVar264 + auVar20._12_4_ * fVar174 + fVar149 * auVar189._12_4_
  ;
  auVar205._0_4_ = auVar121._0_4_ * fVar326 + fVar319 * auVar98._0_4_ + fVar251 * auVar122._0_4_;
  auVar205._4_4_ = auVar121._4_4_ * fVar330 + fVar328 * auVar98._4_4_ + fVar260 * auVar122._4_4_;
  auVar205._8_4_ = auVar121._8_4_ * fVar154 + fVar146 * auVar98._8_4_ + fVar262 * auVar122._8_4_;
  auVar205._12_4_ = auVar121._12_4_ * fVar149 + fVar174 * auVar98._12_4_ + fVar264 * auVar122._12_4_
  ;
  auVar356._8_4_ = 0x7fffffff;
  auVar356._0_8_ = 0x7fffffff7fffffff;
  auVar356._12_4_ = 0x7fffffff;
  auVar121 = vandps_avx(auVar288,auVar356);
  auVar337._8_4_ = 0x219392ef;
  auVar337._0_8_ = 0x219392ef219392ef;
  auVar337._12_4_ = 0x219392ef;
  auVar121 = vcmpps_avx(auVar121,auVar337,1);
  auVar15 = vblendvps_avx(auVar288,auVar337,auVar121);
  auVar121 = vandps_avx(auVar356,auVar100);
  auVar121 = vcmpps_avx(auVar121,auVar337,1);
  auVar17 = vblendvps_avx(auVar100,auVar337,auVar121);
  auVar121 = vandps_avx(auVar322,auVar356);
  auVar121 = vcmpps_avx(auVar121,auVar337,1);
  auVar121 = vblendvps_avx(auVar322,auVar337,auVar121);
  auVar18 = vrcpps_avx(auVar15);
  fVar251 = auVar18._0_4_;
  auVar253._0_4_ = fVar251 * auVar15._0_4_;
  fVar260 = auVar18._4_4_;
  auVar253._4_4_ = fVar260 * auVar15._4_4_;
  fVar262 = auVar18._8_4_;
  auVar253._8_4_ = fVar262 * auVar15._8_4_;
  fVar264 = auVar18._12_4_;
  auVar253._12_4_ = fVar264 * auVar15._12_4_;
  auVar338._8_4_ = 0x3f800000;
  auVar338._0_8_ = 0x3f8000003f800000;
  auVar338._12_4_ = 0x3f800000;
  auVar15 = vsubps_avx(auVar338,auVar253);
  fVar251 = fVar251 + fVar251 * auVar15._0_4_;
  fVar260 = fVar260 + fVar260 * auVar15._4_4_;
  fVar262 = fVar262 + fVar262 * auVar15._8_4_;
  fVar264 = fVar264 + fVar264 * auVar15._12_4_;
  auVar15 = vrcpps_avx(auVar17);
  fVar287 = auVar15._0_4_;
  auVar156._0_4_ = fVar287 * auVar17._0_4_;
  fVar294 = auVar15._4_4_;
  auVar156._4_4_ = fVar294 * auVar17._4_4_;
  fVar295 = auVar15._8_4_;
  auVar156._8_4_ = fVar295 * auVar17._8_4_;
  fVar296 = auVar15._12_4_;
  auVar156._12_4_ = fVar296 * auVar17._12_4_;
  auVar15 = vsubps_avx(auVar338,auVar156);
  fVar287 = fVar287 + fVar287 * auVar15._0_4_;
  fVar294 = fVar294 + fVar294 * auVar15._4_4_;
  fVar295 = fVar295 + fVar295 * auVar15._8_4_;
  fVar296 = fVar296 + fVar296 * auVar15._12_4_;
  auVar15 = vrcpps_avx(auVar121);
  fVar319 = auVar15._0_4_;
  auVar323._0_4_ = auVar121._0_4_ * fVar319;
  fVar326 = auVar15._4_4_;
  auVar323._4_4_ = auVar121._4_4_ * fVar326;
  fVar328 = auVar15._8_4_;
  auVar323._8_4_ = auVar121._8_4_ * fVar328;
  fVar330 = auVar15._12_4_;
  auVar323._12_4_ = auVar121._12_4_ * fVar330;
  auVar121 = vsubps_avx(auVar338,auVar323);
  fVar319 = auVar121._0_4_ * fVar319 + fVar319;
  fVar326 = auVar121._4_4_ * fVar326 + fVar326;
  fVar328 = auVar121._8_4_ * fVar328 + fVar328;
  fVar330 = auVar121._12_4_ * fVar330 + fVar330;
  auVar17 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                         *(float *)(prim + lVar89 + 0x16)) *
                                        *(float *)(prim + lVar89 + 0x1a))),0);
  auVar121 = vcvtdq2ps_avx(auVar93);
  auVar15 = vcvtdq2ps_avx(auVar123);
  auVar15 = vsubps_avx(auVar15,auVar121);
  fVar146 = auVar17._0_4_;
  fVar154 = auVar17._4_4_;
  fVar174 = auVar17._8_4_;
  fVar149 = auVar17._12_4_;
  auVar93._0_4_ = fVar146 * auVar15._0_4_ + auVar121._0_4_;
  auVar93._4_4_ = fVar154 * auVar15._4_4_ + auVar121._4_4_;
  auVar93._8_4_ = fVar174 * auVar15._8_4_ + auVar121._8_4_;
  auVar93._12_4_ = fVar149 * auVar15._12_4_ + auVar121._12_4_;
  auVar121 = vcvtdq2ps_avx(auVar94);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar15 = vpmovsxwd_avx(auVar18);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar17 = vsubps_avx(auVar15,auVar121);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  auVar184._0_4_ = fVar146 * auVar17._0_4_ + auVar121._0_4_;
  auVar184._4_4_ = fVar154 * auVar17._4_4_ + auVar121._4_4_;
  auVar184._8_4_ = fVar174 * auVar17._8_4_ + auVar121._8_4_;
  auVar184._12_4_ = fVar149 * auVar17._12_4_ + auVar121._12_4_;
  auVar121 = vcvtdq2ps_avx(auVar15);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar83 * 0x16 + 6);
  auVar15 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar121);
  auVar229._0_4_ = auVar15._0_4_ * fVar146 + auVar121._0_4_;
  auVar229._4_4_ = auVar15._4_4_ * fVar154 + auVar121._4_4_;
  auVar229._8_4_ = auVar15._8_4_ * fVar174 + auVar121._8_4_;
  auVar229._12_4_ = auVar15._12_4_ * fVar149 + auVar121._12_4_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar83 * 0x14 + 6);
  auVar121 = vpmovsxwd_avx(auVar192);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar15 = vpmovsxwd_avx(auVar207);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar121);
  auVar339._0_4_ = auVar15._0_4_ * fVar146 + auVar121._0_4_;
  auVar339._4_4_ = auVar15._4_4_ * fVar154 + auVar121._4_4_;
  auVar339._8_4_ = auVar15._8_4_ * fVar174 + auVar121._8_4_;
  auVar339._12_4_ = auVar15._12_4_ * fVar149 + auVar121._12_4_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar121 = vpmovsxwd_avx(auVar189);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar83 * 0x21 + 6);
  auVar15 = vpmovsxwd_avx(auVar98);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar121);
  auVar357._0_4_ = auVar15._0_4_ * fVar146 + auVar121._0_4_;
  auVar357._4_4_ = auVar15._4_4_ * fVar154 + auVar121._4_4_;
  auVar357._8_4_ = auVar15._8_4_ * fVar174 + auVar121._8_4_;
  auVar357._12_4_ = auVar15._12_4_ * fVar149 + auVar121._12_4_;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar83 * 0x1f + 6);
  auVar121 = vpmovsxwd_avx(auVar122);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar15 = vpmovsxwd_avx(auVar123);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar121);
  auVar157._0_4_ = auVar121._0_4_ + auVar15._0_4_ * fVar146;
  auVar157._4_4_ = auVar121._4_4_ + auVar15._4_4_ * fVar154;
  auVar157._8_4_ = auVar121._8_4_ + auVar15._8_4_ * fVar174;
  auVar157._12_4_ = auVar121._12_4_ + auVar15._12_4_ * fVar149;
  auVar121 = vsubps_avx(auVar93,auVar299);
  auVar94._0_4_ = fVar251 * auVar121._0_4_;
  auVar94._4_4_ = fVar260 * auVar121._4_4_;
  auVar94._8_4_ = fVar262 * auVar121._8_4_;
  auVar94._12_4_ = fVar264 * auVar121._12_4_;
  auVar121 = vsubps_avx(auVar184,auVar299);
  auVar185._0_4_ = fVar251 * auVar121._0_4_;
  auVar185._4_4_ = fVar260 * auVar121._4_4_;
  auVar185._8_4_ = fVar262 * auVar121._8_4_;
  auVar185._12_4_ = fVar264 * auVar121._12_4_;
  auVar121 = vsubps_avx(auVar229,auVar269);
  auVar230._0_4_ = fVar287 * auVar121._0_4_;
  auVar230._4_4_ = fVar294 * auVar121._4_4_;
  auVar230._8_4_ = fVar295 * auVar121._8_4_;
  auVar230._12_4_ = fVar296 * auVar121._12_4_;
  auVar121 = vsubps_avx(auVar339,auVar269);
  auVar254._0_4_ = fVar287 * auVar121._0_4_;
  auVar254._4_4_ = fVar294 * auVar121._4_4_;
  auVar254._8_4_ = fVar295 * auVar121._8_4_;
  auVar254._12_4_ = fVar296 * auVar121._12_4_;
  auVar121 = vsubps_avx(auVar357,auVar205);
  auVar270._0_4_ = fVar319 * auVar121._0_4_;
  auVar270._4_4_ = fVar326 * auVar121._4_4_;
  auVar270._8_4_ = fVar328 * auVar121._8_4_;
  auVar270._12_4_ = fVar330 * auVar121._12_4_;
  auVar121 = vsubps_avx(auVar157,auVar205);
  auVar158._0_4_ = fVar319 * auVar121._0_4_;
  auVar158._4_4_ = fVar326 * auVar121._4_4_;
  auVar158._8_4_ = fVar328 * auVar121._8_4_;
  auVar158._12_4_ = fVar330 * auVar121._12_4_;
  auVar121 = vpminsd_avx(auVar94,auVar185);
  auVar15 = vpminsd_avx(auVar230,auVar254);
  auVar121 = vmaxps_avx(auVar121,auVar15);
  auVar15 = vpminsd_avx(auVar270,auVar158);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar300._4_4_ = uVar90;
  auVar300._0_4_ = uVar90;
  auVar300._8_4_ = uVar90;
  auVar300._12_4_ = uVar90;
  auVar15 = vmaxps_avx(auVar15,auVar300);
  auVar121 = vmaxps_avx(auVar121,auVar15);
  local_7c0._0_4_ = auVar121._0_4_ * 0.99999964;
  local_7c0._4_4_ = auVar121._4_4_ * 0.99999964;
  local_7c0._8_4_ = auVar121._8_4_ * 0.99999964;
  local_7c0._12_4_ = auVar121._12_4_ * 0.99999964;
  auVar121 = vpmaxsd_avx(auVar94,auVar185);
  auVar15 = vpmaxsd_avx(auVar230,auVar254);
  auVar121 = vminps_avx(auVar121,auVar15);
  auVar15 = vpmaxsd_avx(auVar270,auVar158);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar186._4_4_ = uVar90;
  auVar186._0_4_ = uVar90;
  auVar186._8_4_ = uVar90;
  auVar186._12_4_ = uVar90;
  auVar15 = vminps_avx(auVar15,auVar186);
  auVar121 = vminps_avx(auVar121,auVar15);
  auVar95._0_4_ = auVar121._0_4_ * 1.0000004;
  auVar95._4_4_ = auVar121._4_4_ * 1.0000004;
  auVar95._8_4_ = auVar121._8_4_ * 1.0000004;
  auVar95._12_4_ = auVar121._12_4_ * 1.0000004;
  auVar121 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar15 = vpcmpgtd_avx(auVar121,_DAT_01f4ad30);
  auVar121 = vcmpps_avx(local_7c0,auVar95,2);
  auVar121 = vandps_avx(auVar121,auVar15);
  uVar90 = vmovmskps_avx(auVar121);
  uVar83 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar90);
  auVar104._16_16_ = mm_lookupmask_ps._240_16_;
  auVar104._0_16_ = mm_lookupmask_ps._240_16_;
  local_5e0 = vblendps_avx(auVar104,ZEXT832(0) << 0x20,0x80);
  local_ae8 = (undefined1 (*) [32])&local_6c0;
  uVar87 = 1 << ((byte)k & 0x1f);
  local_af0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar87 & 0xf) << 4));
  local_af8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar87 >> 4) * 0x10);
  local_9a8 = prim;
LAB_0092d820:
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  if (uVar83 == 0) {
    return;
  }
  lVar89 = 0;
  if (uVar83 != 0) {
    for (; (uVar83 >> lVar89 & 1) == 0; lVar89 = lVar89 + 1) {
    }
  }
  uVar87 = *(uint *)(local_9a8 + 2);
  local_9a0 = (ulong)*(uint *)(local_9a8 + lVar89 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar87].ptr;
  uVar84 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           local_9a0 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar319 = (pGVar9->time_range).lower;
  fVar319 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar319) / ((pGVar9->time_range).upper - fVar319));
  auVar121 = vroundss_avx(ZEXT416((uint)fVar319),ZEXT416((uint)fVar319),9);
  auVar121 = vminss_avx(auVar121,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar121 = vmaxss_avx(ZEXT816(0) << 0x20,auVar121);
  fVar319 = fVar319 - auVar121._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar88 = (long)(int)auVar121._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar88);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar88);
  auVar121 = vshufps_avx(ZEXT416((uint)(1.0 - fVar319)),ZEXT416((uint)(1.0 - fVar319)),0);
  pfVar1 = (float *)(lVar11 + lVar12 * uVar84);
  fVar146 = auVar121._0_4_;
  fVar154 = auVar121._4_4_;
  fVar174 = auVar121._8_4_;
  fVar149 = auVar121._12_4_;
  pfVar2 = (float *)(lVar11 + lVar12 * (uVar84 + 1));
  pfVar3 = (float *)(lVar11 + lVar12 * (uVar84 + 2));
  pfVar4 = (float *)(lVar11 + lVar12 * (uVar84 + 3));
  lVar11 = *(long *)(_Var10 + 0x38 + lVar88);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar88);
  auVar121 = vshufps_avx(ZEXT416((uint)fVar319),ZEXT416((uint)fVar319),0);
  pfVar5 = (float *)(lVar11 + uVar84 * lVar12);
  fVar251 = auVar121._0_4_;
  fVar260 = auVar121._4_4_;
  fVar262 = auVar121._8_4_;
  fVar264 = auVar121._12_4_;
  pfVar6 = (float *)(lVar11 + (uVar84 + 1) * lVar12);
  pfVar7 = (float *)(lVar11 + (uVar84 + 2) * lVar12);
  auVar289._0_4_ = fVar251 * *pfVar5 + fVar146 * *pfVar1;
  auVar289._4_4_ = fVar260 * pfVar5[1] + fVar154 * pfVar1[1];
  auVar289._8_4_ = fVar262 * pfVar5[2] + fVar174 * pfVar1[2];
  auVar289._12_4_ = fVar264 * pfVar5[3] + fVar149 * pfVar1[3];
  auVar187._0_4_ = fVar146 * *pfVar2 + fVar251 * *pfVar6;
  auVar187._4_4_ = fVar154 * pfVar2[1] + fVar260 * pfVar6[1];
  auVar187._8_4_ = fVar174 * pfVar2[2] + fVar262 * pfVar6[2];
  auVar187._12_4_ = fVar149 * pfVar2[3] + fVar264 * pfVar6[3];
  auVar121 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar15 = vinsertps_avx(auVar121,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar319 = *(float *)(ray + k * 4 + 0x80);
  auVar358._4_4_ = fVar319;
  auVar358._0_4_ = fVar319;
  auVar358._8_4_ = fVar319;
  auVar358._12_4_ = fVar319;
  fStack_950 = fVar319;
  _local_960 = auVar358;
  fStack_94c = fVar319;
  fStack_948 = fVar319;
  fStack_944 = fVar319;
  fVar326 = *(float *)(ray + k * 4 + 0xa0);
  auVar381._4_4_ = fVar326;
  auVar381._0_4_ = fVar326;
  auVar381._8_4_ = fVar326;
  auVar381._12_4_ = fVar326;
  fStack_850 = fVar326;
  _local_860 = auVar381;
  fStack_84c = fVar326;
  fStack_848 = fVar326;
  fStack_844 = fVar326;
  auVar231._0_4_ = fVar146 * *pfVar3 + fVar251 * *pfVar7;
  auVar231._4_4_ = fVar154 * pfVar3[1] + fVar260 * pfVar7[1];
  auVar231._8_4_ = fVar174 * pfVar3[2] + fVar262 * pfVar7[2];
  auVar231._12_4_ = fVar149 * pfVar3[3] + fVar264 * pfVar7[3];
  auVar121 = vunpcklps_avx(auVar358,auVar381);
  fVar328 = *(float *)(ray + k * 4 + 0xc0);
  auVar393._4_4_ = fVar328;
  auVar393._0_4_ = fVar328;
  auVar393._8_4_ = fVar328;
  auVar393._12_4_ = fVar328;
  fStack_870 = fVar328;
  _local_880 = auVar393;
  fStack_86c = fVar328;
  fStack_868 = fVar328;
  fStack_864 = fVar328;
  _local_a30 = vinsertps_avx(auVar121,auVar393,0x28);
  auVar96._0_4_ = (auVar289._0_4_ + auVar187._0_4_) * 0.5;
  auVar96._4_4_ = (auVar289._4_4_ + auVar187._4_4_) * 0.5;
  auVar96._8_4_ = (auVar289._8_4_ + auVar187._8_4_) * 0.5;
  auVar96._12_4_ = (auVar289._12_4_ + auVar187._12_4_) * 0.5;
  auVar121 = vsubps_avx(auVar96,auVar15);
  auVar121 = vdpps_avx(auVar121,_local_a30,0x7f);
  local_a40 = vdpps_avx(_local_a30,_local_a30,0x7f);
  auVar345 = ZEXT1664(local_a40);
  auVar17 = vrcpss_avx(local_a40,local_a40);
  fVar330 = auVar121._0_4_ * auVar17._0_4_ * (2.0 - local_a40._0_4_ * auVar17._0_4_);
  auVar17 = vshufps_avx(ZEXT416((uint)fVar330),ZEXT416((uint)fVar330),0);
  auVar206._0_4_ = auVar15._0_4_ + local_a30._0_4_ * auVar17._0_4_;
  auVar206._4_4_ = auVar15._4_4_ + local_a30._4_4_ * auVar17._4_4_;
  auVar206._8_4_ = auVar15._8_4_ + local_a30._8_4_ * auVar17._8_4_;
  auVar206._12_4_ = auVar15._12_4_ + local_a30._12_4_ * auVar17._12_4_;
  auVar121 = vblendps_avx(auVar206,_DAT_01f45a50,8);
  auVar19 = vsubps_avx(auVar289,auVar121);
  pfVar1 = (float *)(lVar11 + lVar12 * (uVar84 + 3));
  auVar20 = vsubps_avx(auVar231,auVar121);
  auVar120._0_4_ = fVar146 * *pfVar4 + fVar251 * *pfVar1;
  auVar120._4_4_ = fVar154 * pfVar4[1] + fVar260 * pfVar1[1];
  auVar120._8_4_ = fVar174 * pfVar4[2] + fVar262 * pfVar1[2];
  auVar120._12_4_ = fVar149 * pfVar4[3] + fVar264 * pfVar1[3];
  _local_b40 = vsubps_avx(auVar187,auVar121);
  _local_b50 = vsubps_avx(auVar120,auVar121);
  auVar293 = ZEXT1664(_local_b50);
  auVar121 = vshufps_avx(auVar19,auVar19,0);
  register0x00001250 = auVar121;
  _local_4c0 = auVar121;
  auVar121 = vshufps_avx(auVar19,auVar19,0x55);
  register0x00001250 = auVar121;
  _local_1e0 = auVar121;
  auVar121 = vshufps_avx(auVar19,auVar19,0xaa);
  register0x00001250 = auVar121;
  _local_200 = auVar121;
  auVar121 = vshufps_avx(auVar19,auVar19,0xff);
  register0x00001290 = auVar121;
  _local_220 = auVar121;
  auVar121 = vshufps_avx(_local_b40,_local_b40,0);
  register0x00001290 = auVar121;
  _local_4e0 = auVar121;
  auVar121 = vshufps_avx(_local_b40,_local_b40,0x55);
  register0x00001290 = auVar121;
  _local_500 = auVar121;
  auVar121 = vshufps_avx(_local_b40,_local_b40,0xaa);
  register0x00001290 = auVar121;
  _local_520 = auVar121;
  auVar121 = vshufps_avx(_local_b40,_local_b40,0xff);
  register0x00001290 = auVar121;
  _local_540 = auVar121;
  auVar15 = vshufps_avx(auVar20,auVar20,0);
  auVar121 = vshufps_avx(auVar20,auVar20,0x55);
  register0x00001290 = auVar121;
  _local_560 = auVar121;
  auVar121 = vshufps_avx(auVar20,auVar20,0xaa);
  register0x00001290 = auVar121;
  _local_580 = auVar121;
  auVar121 = vshufps_avx(auVar20,auVar20,0xff);
  register0x00001290 = auVar121;
  _local_5a0 = auVar121;
  auVar121 = vshufps_avx(_local_b50,_local_b50,0);
  local_320._16_16_ = auVar121;
  local_320._0_16_ = auVar121;
  auVar18 = vshufps_avx(_local_b50,_local_b50,0x55);
  auVar121 = vshufps_avx(_local_b50,_local_b50,0xaa);
  register0x00001290 = auVar121;
  _local_5c0 = auVar121;
  auVar121 = vshufps_avx(_local_b50,_local_b50,0xff);
  register0x00001290 = auVar121;
  _local_240 = auVar121;
  auVar121 = ZEXT416((uint)(fVar319 * fVar319 + fVar326 * fVar326 + fVar328 * fVar328));
  auVar121 = vshufps_avx(auVar121,auVar121,0);
  local_260._16_16_ = auVar121;
  local_260._0_16_ = auVar121;
  fVar319 = *(float *)(ray + k * 4 + 0x60);
  local_9c0 = ZEXT416((uint)fVar330);
  auVar121 = vshufps_avx(ZEXT416((uint)(fVar319 - fVar330)),ZEXT416((uint)(fVar319 - fVar330)),0);
  local_340._16_16_ = auVar121;
  local_340._0_16_ = auVar121;
  auVar121 = vpshufd_avx(ZEXT416(uVar87),0);
  local_620._16_16_ = auVar121;
  local_620._0_16_ = auVar121;
  auVar121 = vpshufd_avx(ZEXT416(*(uint *)(local_9a8 + lVar89 * 4 + 6)),0);
  local_640._16_16_ = auVar121;
  local_640._0_16_ = auVar121;
  register0x00001210 = auVar17;
  _local_a20 = auVar17;
  uVar84 = 0;
  local_d24 = 1;
  local_600 = vandps_avx(auVar105,local_260);
  auVar121 = vsqrtss_avx(local_a40,local_a40);
  auVar17 = vsqrtss_avx(local_a40,local_a40);
  local_7b0 = ZEXT816(0x3f80000000000000);
  do {
    auVar237._8_4_ = 0x3f800000;
    auVar237._0_8_ = 0x3f8000003f800000;
    auVar237._12_4_ = 0x3f800000;
    auVar237._16_4_ = 0x3f800000;
    auVar237._20_4_ = 0x3f800000;
    auVar237._24_4_ = 0x3f800000;
    auVar237._28_4_ = 0x3f800000;
    auVar192 = vmovshdup_avx(local_7b0);
    auVar189 = vsubps_avx(auVar192,local_7b0);
    auVar192 = vshufps_avx(local_7b0,local_7b0,0);
    local_8c0._16_16_ = auVar192;
    local_8c0._0_16_ = auVar192;
    auVar207 = vshufps_avx(auVar189,auVar189,0);
    local_8e0._16_16_ = auVar207;
    local_8e0._0_16_ = auVar207;
    fVar226 = auVar207._0_4_;
    fVar227 = auVar207._4_4_;
    fVar392 = auVar207._8_4_;
    fVar396 = auVar207._12_4_;
    fVar223 = auVar192._0_4_;
    auVar200._0_4_ = fVar223 + fVar226 * 0.0;
    fVar224 = auVar192._4_4_;
    auVar200._4_4_ = fVar224 + fVar227 * 0.14285715;
    fVar225 = auVar192._8_4_;
    auVar200._8_4_ = fVar225 + fVar392 * 0.2857143;
    fStack_ac4 = auVar192._12_4_;
    auVar200._12_4_ = fStack_ac4 + fVar396 * 0.42857146;
    auVar200._16_4_ = fVar223 + fVar226 * 0.5714286;
    auVar200._20_4_ = fVar224 + fVar227 * 0.71428573;
    auVar200._24_4_ = fVar225 + fVar392 * 0.8571429;
    auVar200._28_4_ = fStack_ac4 + fVar396;
    auVar104 = vsubps_avx(auVar237,auVar200);
    local_ae0._4_4_ = auVar200._4_4_ * auVar200._4_4_;
    local_ae0._0_4_ = auVar200._0_4_ * auVar200._0_4_;
    fStack_ad8 = auVar200._8_4_ * auVar200._8_4_;
    fStack_ad4 = auVar200._12_4_ * auVar200._12_4_;
    fStack_ad0 = auVar200._16_4_ * auVar200._16_4_;
    fStack_acc = auVar200._20_4_ * auVar200._20_4_;
    fStack_ac8 = auVar200._24_4_ * auVar200._24_4_;
    fVar260 = auVar200._0_4_ * 3.0;
    fVar262 = auVar200._4_4_ * 3.0;
    fVar264 = auVar200._8_4_ * 3.0;
    fVar287 = auVar200._12_4_ * 3.0;
    fVar294 = auVar200._16_4_ * 3.0;
    fVar295 = auVar200._20_4_ * 3.0;
    fVar296 = auVar200._24_4_ * 3.0;
    fVar326 = auVar104._0_4_;
    auVar325._0_4_ = fVar326 * fVar326;
    fVar328 = auVar104._4_4_;
    auVar325._4_4_ = fVar328 * fVar328;
    fVar330 = auVar104._8_4_;
    auVar325._8_4_ = fVar330 * fVar330;
    fVar146 = auVar104._12_4_;
    auVar325._12_4_ = fVar146 * fVar146;
    fVar154 = auVar104._16_4_;
    auVar325._16_4_ = fVar154 * fVar154;
    fVar174 = auVar104._20_4_;
    auVar325._20_4_ = fVar174 * fVar174;
    fVar149 = auVar104._24_4_;
    auVar325._28_36_ = auVar293._28_36_;
    auVar325._24_4_ = fVar149 * fVar149;
    fVar251 = auVar104._28_4_;
    fVar228 = (auVar325._0_4_ * (fVar326 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar245 = (auVar325._4_4_ * (fVar328 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar246 = (auVar325._8_4_ * (fVar330 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar247 = (auVar325._12_4_ * (fVar146 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar248 = (auVar325._16_4_ * (fVar154 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar249 = (auVar325._20_4_ * (fVar174 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar250 = (auVar325._24_4_ * (fVar149 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar297 = -fVar326 * auVar200._0_4_ * auVar200._0_4_ * 0.5;
    fVar303 = -fVar328 * auVar200._4_4_ * auVar200._4_4_ * 0.5;
    fVar305 = -fVar330 * auVar200._8_4_ * auVar200._8_4_ * 0.5;
    fVar307 = -fVar146 * auVar200._12_4_ * auVar200._12_4_ * 0.5;
    fVar309 = -fVar154 * auVar200._16_4_ * auVar200._16_4_ * 0.5;
    fVar312 = -fVar174 * auVar200._20_4_ * auVar200._20_4_ * 0.5;
    fVar315 = -fVar149 * auVar200._24_4_ * auVar200._24_4_ * 0.5;
    fVar311 = auVar18._0_4_;
    fVar314 = auVar18._4_4_;
    fVar317 = auVar18._8_4_;
    fVar147 = auVar18._12_4_;
    fVar155 = auVar15._0_4_;
    fVar176 = auVar15._4_4_;
    fVar179 = auVar15._8_4_;
    fVar182 = auVar15._12_4_;
    fVar335 = local_320._28_4_ + fVar182;
    fVar352 = auVar345._28_4_ + fVar182;
    fVar380 = (auVar200._0_4_ * auVar200._0_4_ * (fVar260 + -5.0) + 2.0) * 0.5;
    fVar383 = (auVar200._4_4_ * auVar200._4_4_ * (fVar262 + -5.0) + 2.0) * 0.5;
    fVar384 = (auVar200._8_4_ * auVar200._8_4_ * (fVar264 + -5.0) + 2.0) * 0.5;
    fVar385 = (auVar200._12_4_ * auVar200._12_4_ * (fVar287 + -5.0) + 2.0) * 0.5;
    fVar386 = (auVar200._16_4_ * auVar200._16_4_ * (fVar294 + -5.0) + 2.0) * 0.5;
    fVar387 = (auVar200._20_4_ * auVar200._20_4_ * (fVar295 + -5.0) + 2.0) * 0.5;
    fVar388 = (auVar200._24_4_ * auVar200._24_4_ * (fVar296 + -5.0) + 2.0) * 0.5;
    fVar379 = -auVar200._28_4_;
    fVar353 = -auVar200._0_4_ * fVar326 * fVar326 * 0.5;
    fVar361 = -auVar200._4_4_ * fVar328 * fVar328 * 0.5;
    fVar364 = -auVar200._8_4_ * fVar330 * fVar330 * 0.5;
    fVar367 = -auVar200._12_4_ * fVar146 * fVar146 * 0.5;
    fVar370 = -auVar200._16_4_ * fVar154 * fVar154 * 0.5;
    fVar373 = -auVar200._20_4_ * fVar174 * fVar174 * 0.5;
    fVar376 = -auVar200._24_4_ * fVar149 * fVar149 * 0.5;
    local_a00 = fVar353 * (float)local_4c0._0_4_ +
                fVar380 * (float)local_4e0._0_4_ + local_320._0_4_ * fVar297 + fVar155 * fVar228;
    fStack_9fc = fVar361 * (float)local_4c0._4_4_ +
                 fVar383 * (float)local_4e0._4_4_ + local_320._4_4_ * fVar303 + fVar176 * fVar245;
    fStack_9f8 = fVar364 * fStack_4b8 +
                 fVar384 * fStack_4d8 + local_320._8_4_ * fVar305 + fVar179 * fVar246;
    fStack_9f4 = fVar367 * fStack_4b4 +
                 fVar385 * fStack_4d4 + local_320._12_4_ * fVar307 + fVar182 * fVar247;
    fStack_9f0 = fVar370 * fStack_4b0 +
                 fVar386 * fStack_4d0 + local_320._16_4_ * fVar309 + fVar155 * fVar248;
    fStack_9ec = fVar373 * fStack_4ac +
                 fVar387 * fStack_4cc + local_320._20_4_ * fVar312 + fVar176 * fVar249;
    fStack_9e8 = fVar376 * fStack_4a8 +
                 fVar388 * fStack_4c8 + local_320._24_4_ * fVar315 + fVar179 * fVar250;
    fStack_9e4 = fVar182 + 2.0 + -fVar251 + fVar335;
    fVar298 = (float)local_1e0._0_4_ * fVar353 +
              fVar380 * (float)local_500._0_4_ +
              fVar311 * fVar297 + fVar228 * (float)local_560._0_4_;
    fVar304 = (float)local_1e0._4_4_ * fVar361 +
              fVar383 * (float)local_500._4_4_ +
              fVar314 * fVar303 + fVar245 * (float)local_560._4_4_;
    fVar306 = fStack_1d8 * fVar364 + fVar384 * fStack_4f8 + fVar317 * fVar305 + fVar246 * fStack_558
    ;
    fVar308 = fStack_1d4 * fVar367 + fVar385 * fStack_4f4 + fVar147 * fVar307 + fVar247 * fStack_554
    ;
    fVar310 = fStack_1d0 * fVar370 + fVar386 * fStack_4f0 + fVar311 * fVar309 + fVar248 * fStack_550
    ;
    fVar313 = fStack_1cc * fVar373 + fVar387 * fStack_4ec + fVar314 * fVar312 + fVar249 * fStack_54c
    ;
    fVar316 = fStack_1c8 * fVar376 + fVar388 * fStack_4e8 + fVar317 * fVar315 + fVar250 * fStack_548
    ;
    fVar318 = fStack_9e4 + fVar335 + fVar352;
    fVar153 = (float)local_200._0_4_ * fVar353 +
              fVar380 * (float)local_520._0_4_ +
              fVar297 * (float)local_5c0._0_4_ + fVar228 * (float)local_580._0_4_;
    fVar173 = (float)local_200._4_4_ * fVar361 +
              fVar383 * (float)local_520._4_4_ +
              fVar303 * (float)local_5c0._4_4_ + fVar245 * (float)local_580._4_4_;
    fVar175 = fStack_1f8 * fVar364 +
              fVar384 * fStack_518 + fVar305 * fStack_5b8 + fVar246 * fStack_578;
    fVar177 = fStack_1f4 * fVar367 +
              fVar385 * fStack_514 + fVar307 * fStack_5b4 + fVar247 * fStack_574;
    fVar178 = fStack_1f0 * fVar370 +
              fVar386 * fStack_510 + fVar309 * fStack_5b0 + fVar248 * fStack_570;
    fVar180 = fStack_1ec * fVar373 +
              fVar387 * fStack_50c + fVar312 * fStack_5ac + fVar249 * fStack_56c;
    fVar181 = fStack_1e8 * fVar376 +
              fVar388 * fStack_508 + fVar315 * fStack_5a8 + fVar250 * fStack_568;
    fVar183 = fVar318 + fVar352 + fVar147 + fVar182;
    auVar238._0_4_ =
         (float)local_220._0_4_ * fVar353 +
         fVar380 * (float)local_540._0_4_ +
         fVar297 * (float)local_240._0_4_ + fVar228 * (float)local_5a0._0_4_;
    auVar238._4_4_ =
         (float)local_220._4_4_ * fVar361 +
         fVar383 * (float)local_540._4_4_ +
         fVar303 * (float)local_240._4_4_ + fVar245 * (float)local_5a0._4_4_;
    auVar238._8_4_ =
         fStack_218 * fVar364 + fVar384 * fStack_538 + fVar305 * fStack_238 + fVar246 * fStack_598;
    auVar238._12_4_ =
         fStack_214 * fVar367 + fVar385 * fStack_534 + fVar307 * fStack_234 + fVar247 * fStack_594;
    auVar238._16_4_ =
         fStack_210 * fVar370 + fVar386 * fStack_530 + fVar309 * fStack_230 + fVar248 * fStack_590;
    auVar238._20_4_ =
         fStack_20c * fVar373 + fVar387 * fStack_52c + fVar312 * fStack_22c + fVar249 * fStack_58c;
    auVar238._24_4_ =
         fStack_208 * fVar376 + fVar388 * fStack_528 + fVar315 * fStack_228 + fVar250 * fStack_588;
    auVar238._28_4_ = fVar318 + fVar182 + 2.0 + -fVar251 + -3.0;
    fVar367 = auVar200._28_4_ + auVar200._28_4_;
    auVar25._4_4_ = (fVar328 + fVar328) * auVar200._4_4_;
    auVar25._0_4_ = (fVar326 + fVar326) * auVar200._0_4_;
    auVar25._8_4_ = (fVar330 + fVar330) * auVar200._8_4_;
    auVar25._12_4_ = (fVar146 + fVar146) * auVar200._12_4_;
    auVar25._16_4_ = (fVar154 + fVar154) * auVar200._16_4_;
    auVar25._20_4_ = (fVar174 + fVar174) * auVar200._20_4_;
    auVar25._24_4_ = (fVar149 + fVar149) * auVar200._24_4_;
    auVar25._28_4_ = fVar367;
    auVar104 = vsubps_avx(auVar25,auVar325._0_32_);
    auVar21._4_4_ = (fVar328 + fVar328) * (fVar262 + 2.0);
    auVar21._0_4_ = (fVar326 + fVar326) * (fVar260 + 2.0);
    auVar21._8_4_ = (fVar330 + fVar330) * (fVar264 + 2.0);
    auVar21._12_4_ = (fVar146 + fVar146) * (fVar287 + 2.0);
    auVar21._16_4_ = (fVar154 + fVar154) * (fVar294 + 2.0);
    auVar21._20_4_ = (fVar174 + fVar174) * (fVar295 + 2.0);
    auVar21._24_4_ = (fVar149 + fVar149) * (fVar296 + 2.0);
    auVar21._28_4_ = 0x40400000;
    auVar22._4_4_ = fVar328 * fVar328 * 3.0;
    auVar22._0_4_ = fVar326 * fVar326 * 3.0;
    auVar22._8_4_ = fVar330 * fVar330 * 3.0;
    auVar22._12_4_ = fVar146 * fVar146 * 3.0;
    auVar22._16_4_ = fVar154 * fVar154 * 3.0;
    auVar22._20_4_ = fVar174 * fVar174 * 3.0;
    auVar22._24_4_ = fVar149 * fVar149 * 3.0;
    auVar22._28_4_ = fVar251;
    auVar105 = vsubps_avx(auVar21,auVar22);
    auVar25 = vsubps_avx(_local_ae0,auVar25);
    fVar312 = auVar104._0_4_ * 0.5;
    fVar315 = auVar104._4_4_ * 0.5;
    fVar335 = auVar104._8_4_ * 0.5;
    fVar352 = auVar104._12_4_ * 0.5;
    fVar353 = auVar104._16_4_ * 0.5;
    fVar361 = auVar104._20_4_ * 0.5;
    fVar364 = auVar104._24_4_ * 0.5;
    fVar247 = (auVar200._0_4_ * fVar260 + (auVar200._0_4_ + auVar200._0_4_) * (fVar260 + -5.0)) *
              0.5;
    fVar250 = (auVar200._4_4_ * fVar262 + (auVar200._4_4_ + auVar200._4_4_) * (fVar262 + -5.0)) *
              0.5;
    fVar297 = (auVar200._8_4_ * fVar264 + (auVar200._8_4_ + auVar200._8_4_) * (fVar264 + -5.0)) *
              0.5;
    fVar303 = (auVar200._12_4_ * fVar287 + (auVar200._12_4_ + auVar200._12_4_) * (fVar287 + -5.0)) *
              0.5;
    fVar305 = (auVar200._16_4_ * fVar294 + (auVar200._16_4_ + auVar200._16_4_) * (fVar294 + -5.0)) *
              0.5;
    fVar307 = (auVar200._20_4_ * fVar295 + (auVar200._20_4_ + auVar200._20_4_) * (fVar295 + -5.0)) *
              0.5;
    fVar309 = (auVar200._24_4_ * fVar296 + (auVar200._24_4_ + auVar200._24_4_) * (fVar296 + -5.0)) *
              0.5;
    fVar326 = auVar105._0_4_ * 0.5;
    fVar328 = auVar105._4_4_ * 0.5;
    fVar330 = auVar105._8_4_ * 0.5;
    fVar146 = auVar105._12_4_ * 0.5;
    fVar149 = auVar105._16_4_ * 0.5;
    fVar260 = auVar105._20_4_ * 0.5;
    fVar287 = auVar105._24_4_ * 0.5;
    fVar154 = auVar25._0_4_ * 0.5;
    fVar174 = auVar25._4_4_ * 0.5;
    fVar262 = auVar25._8_4_ * 0.5;
    fVar294 = auVar25._12_4_ * 0.5;
    fVar295 = auVar25._16_4_ * 0.5;
    fVar245 = auVar25._20_4_ * 0.5;
    fVar246 = auVar25._24_4_ * 0.5;
    fVar249 = auVar200._28_4_ + -4.0 + auVar105._28_4_ + auVar25._28_4_ + 3.0;
    auVar192 = vpermilps_avx(ZEXT416((uint)(auVar189._0_4_ * 0.04761905)),0);
    fVar296 = auVar192._0_4_;
    fVar385 = fVar296 * (fVar312 * (float)local_4c0._0_4_ +
                        fVar247 * (float)local_4e0._0_4_ +
                        fVar326 * fVar155 + local_320._0_4_ * fVar154);
    fVar228 = auVar192._4_4_;
    fVar387 = fVar228 * (fVar315 * (float)local_4c0._4_4_ +
                        fVar250 * (float)local_4e0._4_4_ +
                        fVar328 * fVar176 + local_320._4_4_ * fVar174);
    auVar302._4_4_ = fVar387;
    auVar302._0_4_ = fVar385;
    fVar248 = auVar192._8_4_;
    fVar277 = fVar248 * (fVar335 * fStack_4b8 +
                        fVar297 * fStack_4d8 + fVar330 * fVar179 + local_320._8_4_ * fVar262);
    auVar302._8_4_ = fVar277;
    fVar264 = auVar192._12_4_;
    fVar279 = fVar264 * (fVar352 * fStack_4b4 +
                        fVar303 * fStack_4d4 + fVar146 * fVar182 + local_320._12_4_ * fVar294);
    auVar302._12_4_ = fVar279;
    fVar281 = fVar296 * (fVar353 * fStack_4b0 +
                        fVar305 * fStack_4d0 + fVar149 * fVar155 + local_320._16_4_ * fVar295);
    auVar302._16_4_ = fVar281;
    fVar283 = fVar228 * (fVar361 * fStack_4ac +
                        fVar307 * fStack_4cc + fVar260 * fVar176 + local_320._20_4_ * fVar245);
    auVar302._20_4_ = fVar283;
    fVar285 = fVar248 * (fVar364 * fStack_4a8 +
                        fVar309 * fStack_4c8 + fVar287 * fVar179 + local_320._24_4_ * fVar246);
    auVar302._24_4_ = fVar285;
    auVar302._28_4_ = fVar251 + fVar251 + auVar104._28_4_ + fVar251 + fVar251 + -4.0;
    fVar336 = fVar296 * ((float)local_1e0._0_4_ * fVar312 +
                        fVar247 * (float)local_500._0_4_ +
                        fVar326 * (float)local_560._0_4_ + fVar154 * fVar311);
    fVar346 = fVar228 * ((float)local_1e0._4_4_ * fVar315 +
                        fVar250 * (float)local_500._4_4_ +
                        fVar328 * (float)local_560._4_4_ + fVar174 * fVar314);
    auVar30._4_4_ = fVar346;
    auVar30._0_4_ = fVar336;
    fVar347 = fVar248 * (fStack_1d8 * fVar335 +
                        fVar297 * fStack_4f8 + fVar330 * fStack_558 + fVar262 * fVar317);
    auVar30._8_4_ = fVar347;
    fVar348 = fVar264 * (fStack_1d4 * fVar352 +
                        fVar303 * fStack_4f4 + fVar146 * fStack_554 + fVar294 * fVar147);
    auVar30._12_4_ = fVar348;
    fVar349 = fVar296 * (fStack_1d0 * fVar353 +
                        fVar305 * fStack_4f0 + fVar149 * fStack_550 + fVar295 * fVar311);
    auVar30._16_4_ = fVar349;
    fVar350 = fVar228 * (fStack_1cc * fVar361 +
                        fVar307 * fStack_4ec + fVar260 * fStack_54c + fVar245 * fVar314);
    auVar30._20_4_ = fVar350;
    fVar351 = fVar248 * (fStack_1c8 * fVar364 +
                        fVar309 * fStack_4e8 + fVar287 * fStack_548 + fVar246 * fVar317);
    auVar30._24_4_ = fVar351;
    auVar30._28_4_ = fStack_1e4;
    fVar354 = fVar296 * ((float)local_200._0_4_ * fVar312 +
                        fVar326 * (float)local_580._0_4_ + fVar154 * (float)local_5c0._0_4_ +
                        fVar247 * (float)local_520._0_4_);
    fVar362 = fVar228 * ((float)local_200._4_4_ * fVar315 +
                        fVar328 * (float)local_580._4_4_ + fVar174 * (float)local_5c0._4_4_ +
                        fVar250 * (float)local_520._4_4_);
    auVar32._4_4_ = fVar362;
    auVar32._0_4_ = fVar354;
    fVar365 = fVar248 * (fStack_1f8 * fVar335 +
                        fVar330 * fStack_578 + fVar262 * fStack_5b8 + fVar297 * fStack_518);
    auVar32._8_4_ = fVar365;
    fVar368 = fVar264 * (fStack_1f4 * fVar352 +
                        fVar146 * fStack_574 + fVar294 * fStack_5b4 + fVar303 * fStack_514);
    auVar32._12_4_ = fVar368;
    fVar371 = fVar296 * (fStack_1f0 * fVar353 +
                        fVar149 * fStack_570 + fVar295 * fStack_5b0 + fVar305 * fStack_510);
    auVar32._16_4_ = fVar371;
    fVar374 = fVar228 * (fStack_1ec * fVar361 +
                        fVar260 * fStack_56c + fVar245 * fStack_5ac + fVar307 * fStack_50c);
    auVar32._20_4_ = fVar374;
    fVar377 = fVar248 * (fStack_1e8 * fVar364 +
                        fVar287 * fStack_568 + fVar246 * fStack_5a8 + fVar309 * fStack_508);
    auVar32._24_4_ = fVar377;
    auVar32._28_4_ = fVar379;
    fVar154 = fVar296 * ((float)local_220._0_4_ * fVar312 +
                        fVar247 * (float)local_540._0_4_ +
                        fVar326 * (float)local_5a0._0_4_ + (float)local_240._0_4_ * fVar154);
    fVar174 = fVar228 * ((float)local_220._4_4_ * fVar315 +
                        fVar250 * (float)local_540._4_4_ +
                        fVar328 * (float)local_5a0._4_4_ + (float)local_240._4_4_ * fVar174);
    auVar23._4_4_ = fVar174;
    auVar23._0_4_ = fVar154;
    fVar262 = fVar248 * (fStack_218 * fVar335 +
                        fVar297 * fStack_538 + fVar330 * fStack_598 + fStack_238 * fVar262);
    auVar23._8_4_ = fVar262;
    fVar264 = fVar264 * (fStack_214 * fVar352 +
                        fVar303 * fStack_534 + fVar146 * fStack_594 + fStack_234 * fVar294);
    auVar23._12_4_ = fVar264;
    fVar296 = fVar296 * (fStack_210 * fVar353 +
                        fVar305 * fStack_530 + fVar149 * fStack_590 + fStack_230 * fVar295);
    auVar23._16_4_ = fVar296;
    fVar228 = fVar228 * (fStack_20c * fVar361 +
                        fVar307 * fStack_52c + fVar260 * fStack_58c + fStack_22c * fVar245);
    auVar23._20_4_ = fVar228;
    fVar248 = fVar248 * (fStack_208 * fVar364 +
                        fVar309 * fStack_528 + fVar287 * fStack_588 + fStack_228 * fVar246);
    auVar23._24_4_ = fVar248;
    auVar23._28_4_ = fVar249;
    auVar77._4_4_ = fVar304;
    auVar77._0_4_ = fVar298;
    auVar77._8_4_ = fVar306;
    auVar77._12_4_ = fVar308;
    auVar77._16_4_ = fVar310;
    auVar77._20_4_ = fVar313;
    auVar77._24_4_ = fVar316;
    auVar77._28_4_ = fVar318;
    auVar104 = vperm2f128_avx(auVar77,auVar77,1);
    auVar104 = vshufps_avx(auVar104,auVar77,0x30);
    auVar21 = vshufps_avx(auVar77,auVar104,0x29);
    auVar27._4_4_ = fVar173;
    auVar27._0_4_ = fVar153;
    auVar27._8_4_ = fVar175;
    auVar27._12_4_ = fVar177;
    auVar27._16_4_ = fVar178;
    auVar27._20_4_ = fVar180;
    auVar27._24_4_ = fVar181;
    auVar27._28_4_ = fVar183;
    auVar104 = vperm2f128_avx(auVar27,auVar27,1);
    auVar104 = vshufps_avx(auVar104,auVar27,0x30);
    auVar22 = vshufps_avx(auVar27,auVar104,0x29);
    auVar105 = vsubps_avx(auVar238,auVar23);
    auVar104 = vperm2f128_avx(auVar105,auVar105,1);
    auVar104 = vshufps_avx(auVar104,auVar105,0x30);
    auVar23 = vshufps_avx(auVar105,auVar104,0x29);
    local_2a0 = vsubps_avx(auVar21,auVar77);
    local_280 = vsubps_avx(auVar22,auVar27);
    fVar328 = local_2a0._0_4_;
    fVar149 = local_2a0._4_4_;
    auVar24._4_4_ = fVar362 * fVar149;
    auVar24._0_4_ = fVar354 * fVar328;
    fVar287 = local_2a0._8_4_;
    auVar24._8_4_ = fVar365 * fVar287;
    fVar245 = local_2a0._12_4_;
    auVar24._12_4_ = fVar368 * fVar245;
    fVar250 = local_2a0._16_4_;
    auVar24._16_4_ = fVar371 * fVar250;
    fVar309 = local_2a0._20_4_;
    auVar24._20_4_ = fVar374 * fVar309;
    fVar353 = local_2a0._24_4_;
    auVar24._24_4_ = fVar377 * fVar353;
    auVar24._28_4_ = auVar105._28_4_;
    fVar330 = local_280._0_4_;
    fVar251 = local_280._4_4_;
    auVar26._4_4_ = fVar346 * fVar251;
    auVar26._0_4_ = fVar336 * fVar330;
    fVar294 = local_280._8_4_;
    auVar26._8_4_ = fVar347 * fVar294;
    fVar246 = local_280._12_4_;
    auVar26._12_4_ = fVar348 * fVar246;
    fVar297 = local_280._16_4_;
    auVar26._16_4_ = fVar349 * fVar297;
    fVar312 = local_280._20_4_;
    auVar26._20_4_ = fVar350 * fVar312;
    fVar361 = local_280._24_4_;
    auVar26._24_4_ = fVar351 * fVar361;
    auVar26._28_4_ = auVar104._28_4_;
    auVar26 = vsubps_avx(auVar26,auVar24);
    auVar79._4_4_ = fStack_9fc;
    auVar79._0_4_ = local_a00;
    auVar79._8_4_ = fStack_9f8;
    auVar79._12_4_ = fStack_9f4;
    auVar79._16_4_ = fStack_9f0;
    auVar79._20_4_ = fStack_9ec;
    auVar79._24_4_ = fStack_9e8;
    auVar79._28_4_ = fStack_9e4;
    auVar104 = vperm2f128_avx(auVar79,auVar79,1);
    auVar104 = vshufps_avx(auVar104,auVar79,0x30);
    auVar24 = vshufps_avx(auVar79,auVar104,0x29);
    auVar27 = vsubps_avx(auVar24,auVar79);
    auVar341._4_4_ = fVar387 * fVar251;
    auVar341._0_4_ = fVar385 * fVar330;
    auVar341._8_4_ = fVar277 * fVar294;
    auVar341._12_4_ = fVar279 * fVar246;
    auVar341._16_4_ = fVar281 * fVar297;
    auVar341._20_4_ = fVar283 * fVar312;
    auVar341._24_4_ = fVar285 * fVar361;
    auVar341._28_4_ = auVar104._28_4_;
    fVar146 = auVar27._0_4_;
    fVar260 = auVar27._4_4_;
    auVar28._4_4_ = fVar362 * fVar260;
    auVar28._0_4_ = fVar354 * fVar146;
    fVar295 = auVar27._8_4_;
    auVar28._8_4_ = fVar365 * fVar295;
    fVar247 = auVar27._12_4_;
    auVar28._12_4_ = fVar368 * fVar247;
    fVar303 = auVar27._16_4_;
    auVar28._16_4_ = fVar371 * fVar303;
    fVar315 = auVar27._20_4_;
    auVar28._20_4_ = fVar374 * fVar315;
    fVar364 = auVar27._24_4_;
    auVar28._24_4_ = fVar377 * fVar364;
    auVar28._28_4_ = fVar183;
    auVar341 = vsubps_avx(auVar28,auVar341);
    auVar29._4_4_ = fVar346 * fVar260;
    auVar29._0_4_ = fVar336 * fVar146;
    auVar29._8_4_ = fVar347 * fVar295;
    auVar29._12_4_ = fVar348 * fVar247;
    auVar29._16_4_ = fVar349 * fVar303;
    auVar29._20_4_ = fVar350 * fVar315;
    auVar29._24_4_ = fVar351 * fVar364;
    auVar29._28_4_ = fVar183;
    auVar31._4_4_ = fVar149 * fVar387;
    auVar31._0_4_ = fVar328 * fVar385;
    auVar31._8_4_ = fVar287 * fVar277;
    auVar31._12_4_ = fVar245 * fVar279;
    auVar31._16_4_ = fVar250 * fVar281;
    auVar31._20_4_ = fVar309 * fVar283;
    auVar31._24_4_ = fVar353 * fVar285;
    auVar31._28_4_ = fVar367;
    auVar28 = vsubps_avx(auVar31,auVar29);
    fVar326 = auVar28._28_4_;
    auVar201._0_4_ = fVar146 * fVar146 + fVar328 * fVar328 + fVar330 * fVar330;
    auVar201._4_4_ = fVar260 * fVar260 + fVar149 * fVar149 + fVar251 * fVar251;
    auVar201._8_4_ = fVar295 * fVar295 + fVar287 * fVar287 + fVar294 * fVar294;
    auVar201._12_4_ = fVar247 * fVar247 + fVar245 * fVar245 + fVar246 * fVar246;
    auVar201._16_4_ = fVar303 * fVar303 + fVar250 * fVar250 + fVar297 * fVar297;
    auVar201._20_4_ = fVar315 * fVar315 + fVar309 * fVar309 + fVar312 * fVar312;
    auVar201._24_4_ = fVar364 * fVar364 + fVar353 * fVar353 + fVar361 * fVar361;
    auVar201._28_4_ = fVar326 + fVar326 + auVar26._28_4_;
    auVar104 = vrcpps_avx(auVar201);
    fVar305 = auVar104._0_4_;
    fVar307 = auVar104._4_4_;
    auVar33._4_4_ = fVar307 * auVar201._4_4_;
    auVar33._0_4_ = fVar305 * auVar201._0_4_;
    fVar335 = auVar104._8_4_;
    auVar33._8_4_ = fVar335 * auVar201._8_4_;
    fVar352 = auVar104._12_4_;
    auVar33._12_4_ = fVar352 * auVar201._12_4_;
    fVar311 = auVar104._16_4_;
    auVar33._16_4_ = fVar311 * auVar201._16_4_;
    fVar314 = auVar104._20_4_;
    auVar33._20_4_ = fVar314 * auVar201._20_4_;
    fVar317 = auVar104._24_4_;
    auVar33._24_4_ = fVar317 * auVar201._24_4_;
    auVar33._28_4_ = fVar367;
    auVar165._8_4_ = 0x3f800000;
    auVar165._0_8_ = 0x3f8000003f800000;
    auVar165._12_4_ = 0x3f800000;
    auVar165._16_4_ = 0x3f800000;
    auVar165._20_4_ = 0x3f800000;
    auVar165._24_4_ = 0x3f800000;
    auVar165._28_4_ = 0x3f800000;
    auVar29 = vsubps_avx(auVar165,auVar33);
    fVar305 = fVar305 + fVar305 * auVar29._0_4_;
    fVar307 = fVar307 + fVar307 * auVar29._4_4_;
    fVar335 = fVar335 + fVar335 * auVar29._8_4_;
    fVar352 = fVar352 + fVar352 * auVar29._12_4_;
    fVar311 = fVar311 + fVar311 * auVar29._16_4_;
    fVar314 = fVar314 + fVar314 * auVar29._20_4_;
    fVar317 = fVar317 + fVar317 * auVar29._24_4_;
    auVar105 = vperm2f128_avx(auVar30,auVar30,1);
    auVar105 = vshufps_avx(auVar105,auVar30,0x30);
    auVar105 = vshufps_avx(auVar30,auVar105,0x29);
    auVar25 = vperm2f128_avx(auVar32,auVar32,1);
    auVar25 = vshufps_avx(auVar25,auVar32,0x30);
    local_a60 = vshufps_avx(auVar32,auVar25,0x29);
    fVar355 = local_a60._0_4_;
    fVar363 = local_a60._4_4_;
    auVar34._4_4_ = fVar363 * fVar149;
    auVar34._0_4_ = fVar355 * fVar328;
    fVar366 = local_a60._8_4_;
    auVar34._8_4_ = fVar366 * fVar287;
    fVar369 = local_a60._12_4_;
    auVar34._12_4_ = fVar369 * fVar245;
    fVar372 = local_a60._16_4_;
    auVar34._16_4_ = fVar372 * fVar250;
    fVar375 = local_a60._20_4_;
    auVar34._20_4_ = fVar375 * fVar309;
    fVar378 = local_a60._24_4_;
    auVar34._24_4_ = fVar378 * fVar353;
    auVar34._28_4_ = auVar25._28_4_;
    fVar155 = auVar105._0_4_;
    fVar380 = auVar105._4_4_;
    auVar35._4_4_ = fVar380 * fVar251;
    auVar35._0_4_ = fVar155 * fVar330;
    fVar176 = auVar105._8_4_;
    auVar35._8_4_ = fVar176 * fVar294;
    fVar383 = auVar105._12_4_;
    auVar35._12_4_ = fVar383 * fVar246;
    fVar179 = auVar105._16_4_;
    auVar35._16_4_ = fVar179 * fVar297;
    fVar384 = auVar105._20_4_;
    auVar35._20_4_ = fVar384 * fVar312;
    fVar182 = auVar105._24_4_;
    auVar35._24_4_ = fVar182 * fVar361;
    auVar35._28_4_ = fStack_1e4;
    auVar30 = vsubps_avx(auVar35,auVar34);
    auVar105 = vperm2f128_avx(auVar302,auVar302,1);
    auVar105 = vshufps_avx(auVar105,auVar302,0x30);
    auVar25 = vshufps_avx(auVar302,auVar105,0x29);
    fVar386 = auVar25._0_4_;
    fVar388 = auVar25._4_4_;
    auVar36._4_4_ = fVar388 * fVar251;
    auVar36._0_4_ = fVar386 * fVar330;
    fVar278 = auVar25._8_4_;
    auVar36._8_4_ = fVar278 * fVar294;
    fVar280 = auVar25._12_4_;
    auVar36._12_4_ = fVar280 * fVar246;
    fVar282 = auVar25._16_4_;
    auVar36._16_4_ = fVar282 * fVar297;
    fVar284 = auVar25._20_4_;
    auVar36._20_4_ = fVar284 * fVar312;
    fVar286 = auVar25._24_4_;
    auVar36._24_4_ = fVar286 * fVar361;
    auVar36._28_4_ = auVar105._28_4_;
    auVar37._4_4_ = fVar363 * fVar260;
    auVar37._0_4_ = fVar355 * fVar146;
    auVar37._8_4_ = fVar366 * fVar295;
    auVar37._12_4_ = fVar369 * fVar247;
    auVar37._16_4_ = fVar372 * fVar303;
    auVar37._20_4_ = fVar375 * fVar315;
    uVar91 = local_a60._28_4_;
    auVar37._24_4_ = fVar378 * fVar364;
    auVar37._28_4_ = uVar91;
    auVar105 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar260 * fVar380;
    auVar38._0_4_ = fVar146 * fVar155;
    auVar38._8_4_ = fVar295 * fVar176;
    auVar38._12_4_ = fVar247 * fVar383;
    auVar38._16_4_ = fVar303 * fVar179;
    auVar38._20_4_ = fVar315 * fVar384;
    auVar38._24_4_ = fVar364 * fVar182;
    auVar38._28_4_ = uVar91;
    auVar39._4_4_ = fVar149 * fVar388;
    auVar39._0_4_ = fVar328 * fVar386;
    auVar39._8_4_ = fVar287 * fVar278;
    auVar39._12_4_ = fVar245 * fVar280;
    auVar39._16_4_ = fVar250 * fVar282;
    auVar39._20_4_ = fVar309 * fVar284;
    auVar39._24_4_ = fVar353 * fVar286;
    auVar39._28_4_ = fStack_1c4;
    auVar302 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ =
         fVar307 * (auVar26._4_4_ * auVar26._4_4_ +
                   auVar28._4_4_ * auVar28._4_4_ + auVar341._4_4_ * auVar341._4_4_);
    auVar40._0_4_ =
         fVar305 * (auVar26._0_4_ * auVar26._0_4_ +
                   auVar28._0_4_ * auVar28._0_4_ + auVar341._0_4_ * auVar341._0_4_);
    auVar40._8_4_ =
         fVar335 * (auVar26._8_4_ * auVar26._8_4_ +
                   auVar28._8_4_ * auVar28._8_4_ + auVar341._8_4_ * auVar341._8_4_);
    auVar40._12_4_ =
         fVar352 * (auVar26._12_4_ * auVar26._12_4_ +
                   auVar28._12_4_ * auVar28._12_4_ + auVar341._12_4_ * auVar341._12_4_);
    auVar40._16_4_ =
         fVar311 * (auVar26._16_4_ * auVar26._16_4_ +
                   auVar28._16_4_ * auVar28._16_4_ + auVar341._16_4_ * auVar341._16_4_);
    auVar40._20_4_ =
         fVar314 * (auVar26._20_4_ * auVar26._20_4_ +
                   auVar28._20_4_ * auVar28._20_4_ + auVar341._20_4_ * auVar341._20_4_);
    auVar40._24_4_ =
         fVar317 * (auVar26._24_4_ * auVar26._24_4_ +
                   auVar28._24_4_ * auVar28._24_4_ + auVar341._24_4_ * auVar341._24_4_);
    auVar40._28_4_ = auVar26._28_4_ + fVar326 + auVar341._28_4_;
    auVar41._4_4_ =
         (auVar30._4_4_ * auVar30._4_4_ +
         auVar105._4_4_ * auVar105._4_4_ + auVar302._4_4_ * auVar302._4_4_) * fVar307;
    auVar41._0_4_ =
         (auVar30._0_4_ * auVar30._0_4_ +
         auVar105._0_4_ * auVar105._0_4_ + auVar302._0_4_ * auVar302._0_4_) * fVar305;
    auVar41._8_4_ =
         (auVar30._8_4_ * auVar30._8_4_ +
         auVar105._8_4_ * auVar105._8_4_ + auVar302._8_4_ * auVar302._8_4_) * fVar335;
    auVar41._12_4_ =
         (auVar30._12_4_ * auVar30._12_4_ +
         auVar105._12_4_ * auVar105._12_4_ + auVar302._12_4_ * auVar302._12_4_) * fVar352;
    auVar41._16_4_ =
         (auVar30._16_4_ * auVar30._16_4_ +
         auVar105._16_4_ * auVar105._16_4_ + auVar302._16_4_ * auVar302._16_4_) * fVar311;
    auVar41._20_4_ =
         (auVar30._20_4_ * auVar30._20_4_ +
         auVar105._20_4_ * auVar105._20_4_ + auVar302._20_4_ * auVar302._20_4_) * fVar314;
    auVar41._24_4_ =
         (auVar30._24_4_ * auVar30._24_4_ +
         auVar105._24_4_ * auVar105._24_4_ + auVar302._24_4_ * auVar302._24_4_) * fVar317;
    auVar41._28_4_ = auVar104._28_4_ + auVar29._28_4_;
    auVar104 = vmaxps_avx(auVar40,auVar41);
    auVar105 = vperm2f128_avx(auVar238,auVar238,1);
    auVar105 = vshufps_avx(auVar105,auVar238,0x30);
    auVar26 = vshufps_avx(auVar238,auVar105,0x29);
    auVar133._0_4_ = auVar238._0_4_ + fVar154;
    auVar133._4_4_ = auVar238._4_4_ + fVar174;
    auVar133._8_4_ = auVar238._8_4_ + fVar262;
    auVar133._12_4_ = auVar238._12_4_ + fVar264;
    auVar133._16_4_ = auVar238._16_4_ + fVar296;
    auVar133._20_4_ = auVar238._20_4_ + fVar228;
    auVar133._24_4_ = auVar238._24_4_ + fVar248;
    auVar133._28_4_ = auVar238._28_4_ + fVar249;
    auVar105 = vmaxps_avx(auVar238,auVar133);
    auVar25 = vmaxps_avx(auVar23,auVar26);
    auVar105 = vmaxps_avx(auVar105,auVar25);
    auVar25 = vrsqrtps_avx(auVar201);
    fVar326 = auVar25._0_4_;
    fVar154 = auVar25._4_4_;
    fVar174 = auVar25._8_4_;
    fVar262 = auVar25._12_4_;
    fVar264 = auVar25._16_4_;
    fVar296 = auVar25._20_4_;
    fVar228 = auVar25._24_4_;
    auVar42._4_4_ = fVar154 * fVar154 * fVar154 * auVar201._4_4_ * 0.5;
    auVar42._0_4_ = fVar326 * fVar326 * fVar326 * auVar201._0_4_ * 0.5;
    auVar42._8_4_ = fVar174 * fVar174 * fVar174 * auVar201._8_4_ * 0.5;
    auVar42._12_4_ = fVar262 * fVar262 * fVar262 * auVar201._12_4_ * 0.5;
    auVar42._16_4_ = fVar264 * fVar264 * fVar264 * auVar201._16_4_ * 0.5;
    auVar42._20_4_ = fVar296 * fVar296 * fVar296 * auVar201._20_4_ * 0.5;
    auVar42._24_4_ = fVar228 * fVar228 * fVar228 * auVar201._24_4_ * 0.5;
    auVar42._28_4_ = auVar201._28_4_;
    auVar43._4_4_ = fVar154 * 1.5;
    auVar43._0_4_ = fVar326 * 1.5;
    auVar43._8_4_ = fVar174 * 1.5;
    auVar43._12_4_ = fVar262 * 1.5;
    auVar43._16_4_ = fVar264 * 1.5;
    auVar43._20_4_ = fVar296 * 1.5;
    auVar43._24_4_ = fVar228 * 1.5;
    auVar43._28_4_ = auVar25._28_4_;
    _local_ac0 = vsubps_avx(auVar43,auVar42);
    auVar78._4_4_ = fVar304;
    auVar78._0_4_ = fVar298;
    auVar78._8_4_ = fVar306;
    auVar78._12_4_ = fVar308;
    auVar78._16_4_ = fVar310;
    auVar78._20_4_ = fVar313;
    auVar78._24_4_ = fVar316;
    auVar78._28_4_ = fVar318;
    auVar341 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_aa0 = vsubps_avx(auVar341,auVar78);
    auVar76._4_4_ = fVar173;
    auVar76._0_4_ = fVar153;
    auVar76._8_4_ = fVar175;
    auVar76._12_4_ = fVar177;
    auVar76._16_4_ = fVar178;
    auVar76._20_4_ = fVar180;
    auVar76._24_4_ = fVar181;
    auVar76._28_4_ = fVar183;
    local_a80 = vsubps_avx(auVar341,auVar76);
    fVar320 = local_a80._0_4_;
    fVar327 = local_a80._4_4_;
    fVar329 = local_a80._8_4_;
    fVar331 = local_a80._12_4_;
    fVar332 = local_a80._16_4_;
    fVar333 = local_a80._20_4_;
    fVar334 = local_a80._24_4_;
    fVar154 = local_aa0._0_4_;
    fVar262 = local_aa0._4_4_;
    fVar296 = local_aa0._8_4_;
    fVar248 = local_aa0._12_4_;
    fVar305 = local_aa0._16_4_;
    fVar335 = local_aa0._20_4_;
    fVar311 = local_aa0._24_4_;
    auVar341 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar79);
    fVar391 = auVar341._0_4_;
    fVar394 = auVar341._4_4_;
    fVar395 = auVar341._8_4_;
    fVar397 = auVar341._12_4_;
    fVar398 = auVar341._16_4_;
    fVar399 = auVar341._20_4_;
    fVar400 = auVar341._24_4_;
    auVar301._0_4_ =
         fVar391 * (float)local_960._0_4_ +
         (float)local_860._0_4_ * fVar154 + fVar320 * (float)local_880._0_4_;
    auVar301._4_4_ =
         fVar394 * (float)local_960._4_4_ +
         (float)local_860._4_4_ * fVar262 + fVar327 * (float)local_880._4_4_;
    auVar301._8_4_ = fVar395 * fStack_958 + fStack_858 * fVar296 + fVar329 * fStack_878;
    auVar301._12_4_ = fVar397 * fStack_954 + fStack_854 * fVar248 + fVar331 * fStack_874;
    auVar301._16_4_ = fVar398 * fStack_950 + fStack_850 * fVar305 + fVar332 * fStack_870;
    auVar301._20_4_ = fVar399 * fStack_94c + fStack_84c * fVar335 + fVar333 * fStack_86c;
    auVar301._24_4_ = fVar400 * fStack_948 + fStack_848 * fVar311 + fVar334 * fStack_868;
    auVar301._28_4_ = auVar302._28_4_ + auVar25._28_4_ + auVar201._28_4_;
    auVar359._0_4_ = fVar391 * fVar391 + fVar154 * fVar154 + fVar320 * fVar320;
    auVar359._4_4_ = fVar394 * fVar394 + fVar262 * fVar262 + fVar327 * fVar327;
    auVar359._8_4_ = fVar395 * fVar395 + fVar296 * fVar296 + fVar329 * fVar329;
    auVar359._12_4_ = fVar397 * fVar397 + fVar248 * fVar248 + fVar331 * fVar331;
    auVar359._16_4_ = fVar398 * fVar398 + fVar305 * fVar305 + fVar332 * fVar332;
    auVar359._20_4_ = fVar399 * fVar399 + fVar335 * fVar335 + fVar333 * fVar333;
    auVar359._24_4_ = fVar400 * fVar400 + fVar311 * fVar311 + fVar334 * fVar334;
    auVar359._28_4_ = fStack_1c4 + fStack_1c4 + auVar302._28_4_;
    fVar174 = local_ac0._0_4_;
    fVar264 = local_ac0._4_4_;
    fVar228 = local_ac0._8_4_;
    fVar249 = local_ac0._12_4_;
    fVar307 = local_ac0._16_4_;
    fVar352 = local_ac0._20_4_;
    fVar314 = local_ac0._24_4_;
    local_660._0_4_ =
         (float)local_960._0_4_ * fVar146 * fVar174 +
         fVar328 * fVar174 * (float)local_860._0_4_ + fVar330 * fVar174 * (float)local_880._0_4_;
    local_660._4_4_ =
         (float)local_960._4_4_ * fVar260 * fVar264 +
         fVar149 * fVar264 * (float)local_860._4_4_ + fVar251 * fVar264 * (float)local_880._4_4_;
    local_660._8_4_ =
         fStack_958 * fVar295 * fVar228 +
         fVar287 * fVar228 * fStack_858 + fVar294 * fVar228 * fStack_878;
    local_660._12_4_ =
         fStack_954 * fVar247 * fVar249 +
         fVar245 * fVar249 * fStack_854 + fVar246 * fVar249 * fStack_874;
    local_660._16_4_ =
         fStack_950 * fVar303 * fVar307 +
         fVar250 * fVar307 * fStack_850 + fVar297 * fVar307 * fStack_870;
    local_660._20_4_ =
         fStack_94c * fVar315 * fVar352 +
         fVar309 * fVar352 * fStack_84c + fVar312 * fVar352 * fStack_86c;
    local_660._24_4_ =
         fStack_948 * fVar364 * fVar314 +
         fVar353 * fVar314 * fStack_848 + fVar361 * fVar314 * fStack_868;
    local_660._28_4_ = fStack_944 + fStack_844 + fStack_864;
    fVar326 = fStack_944 + fStack_844 + fStack_864;
    local_680._0_4_ =
         fVar391 * fVar146 * fVar174 + fVar328 * fVar174 * fVar154 + fVar320 * fVar330 * fVar174;
    local_680._4_4_ =
         fVar394 * fVar260 * fVar264 + fVar149 * fVar264 * fVar262 + fVar327 * fVar251 * fVar264;
    local_680._8_4_ =
         fVar395 * fVar295 * fVar228 + fVar287 * fVar228 * fVar296 + fVar329 * fVar294 * fVar228;
    local_680._12_4_ =
         fVar397 * fVar247 * fVar249 + fVar245 * fVar249 * fVar248 + fVar331 * fVar246 * fVar249;
    local_680._16_4_ =
         fVar398 * fVar303 * fVar307 + fVar250 * fVar307 * fVar305 + fVar332 * fVar297 * fVar307;
    local_680._20_4_ =
         fVar399 * fVar315 * fVar352 + fVar309 * fVar352 * fVar335 + fVar333 * fVar312 * fVar352;
    local_680._24_4_ =
         fVar400 * fVar364 * fVar314 + fVar353 * fVar314 * fVar311 + fVar334 * fVar361 * fVar314;
    local_680._28_4_ = fStack_844 + fVar326;
    auVar44._4_4_ = local_660._4_4_ * local_680._4_4_;
    auVar44._0_4_ = local_660._0_4_ * local_680._0_4_;
    auVar44._8_4_ = local_660._8_4_ * local_680._8_4_;
    auVar44._12_4_ = local_660._12_4_ * local_680._12_4_;
    auVar44._16_4_ = local_660._16_4_ * local_680._16_4_;
    auVar44._20_4_ = local_660._20_4_ * local_680._20_4_;
    auVar44._24_4_ = local_660._24_4_ * local_680._24_4_;
    auVar44._28_4_ = fVar326;
    auVar341 = vsubps_avx(auVar301,auVar44);
    auVar45._4_4_ = local_680._4_4_ * local_680._4_4_;
    auVar45._0_4_ = local_680._0_4_ * local_680._0_4_;
    auVar45._8_4_ = local_680._8_4_ * local_680._8_4_;
    auVar45._12_4_ = local_680._12_4_ * local_680._12_4_;
    auVar45._16_4_ = local_680._16_4_ * local_680._16_4_;
    auVar45._20_4_ = local_680._20_4_ * local_680._20_4_;
    auVar45._24_4_ = local_680._24_4_ * local_680._24_4_;
    auVar45._28_4_ = fStack_844;
    auVar28 = vsubps_avx(auVar359,auVar45);
    auVar25 = vsqrtps_avx(auVar104);
    fVar326 = (auVar25._0_4_ + auVar105._0_4_) * 1.0000002;
    fVar317 = (auVar25._4_4_ + auVar105._4_4_) * 1.0000002;
    fVar367 = (auVar25._8_4_ + auVar105._8_4_) * 1.0000002;
    fVar147 = (auVar25._12_4_ + auVar105._12_4_) * 1.0000002;
    fVar370 = (auVar25._16_4_ + auVar105._16_4_) * 1.0000002;
    fVar373 = (auVar25._20_4_ + auVar105._20_4_) * 1.0000002;
    fVar376 = (auVar25._24_4_ + auVar105._24_4_) * 1.0000002;
    auVar46._4_4_ = fVar317 * fVar317;
    auVar46._0_4_ = fVar326 * fVar326;
    auVar46._8_4_ = fVar367 * fVar367;
    auVar46._12_4_ = fVar147 * fVar147;
    auVar46._16_4_ = fVar370 * fVar370;
    auVar46._20_4_ = fVar373 * fVar373;
    auVar46._24_4_ = fVar376 * fVar376;
    auVar46._28_4_ = auVar25._28_4_ + auVar105._28_4_;
    local_3c0._0_4_ = auVar341._0_4_ + auVar341._0_4_;
    local_3c0._4_4_ = auVar341._4_4_ + auVar341._4_4_;
    local_3c0._8_4_ = auVar341._8_4_ + auVar341._8_4_;
    local_3c0._12_4_ = auVar341._12_4_ + auVar341._12_4_;
    local_3c0._16_4_ = auVar341._16_4_ + auVar341._16_4_;
    local_3c0._20_4_ = auVar341._20_4_ + auVar341._20_4_;
    local_3c0._24_4_ = auVar341._24_4_ + auVar341._24_4_;
    fVar326 = auVar341._28_4_;
    local_3c0._28_4_ = fVar326 + fVar326;
    auVar105 = vsubps_avx(auVar28,auVar46);
    auVar47._4_4_ = local_660._4_4_ * local_660._4_4_;
    auVar47._0_4_ = local_660._0_4_ * local_660._0_4_;
    auVar47._8_4_ = local_660._8_4_ * local_660._8_4_;
    auVar47._12_4_ = local_660._12_4_ * local_660._12_4_;
    auVar47._16_4_ = local_660._16_4_ * local_660._16_4_;
    auVar47._20_4_ = local_660._20_4_ * local_660._20_4_;
    auVar47._24_4_ = local_660._24_4_ * local_660._24_4_;
    auVar47._28_4_ = fVar326;
    auVar341 = vsubps_avx(local_260,auVar47);
    auVar48._4_4_ = local_3c0._4_4_ * local_3c0._4_4_;
    auVar48._0_4_ = local_3c0._0_4_ * local_3c0._0_4_;
    auVar48._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    auVar48._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    auVar48._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    auVar48._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    auVar48._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    auVar48._28_4_ = local_260._28_4_;
    fVar326 = auVar341._0_4_;
    fVar317 = auVar341._4_4_;
    fVar367 = auVar341._8_4_;
    fVar147 = auVar341._12_4_;
    fVar370 = auVar341._16_4_;
    fVar373 = auVar341._20_4_;
    fVar376 = auVar341._24_4_;
    auVar49._4_4_ = auVar105._4_4_ * fVar317 * 4.0;
    auVar49._0_4_ = auVar105._0_4_ * fVar326 * 4.0;
    auVar49._8_4_ = auVar105._8_4_ * fVar367 * 4.0;
    auVar49._12_4_ = auVar105._12_4_ * fVar147 * 4.0;
    auVar49._16_4_ = auVar105._16_4_ * fVar370 * 4.0;
    auVar49._20_4_ = auVar105._20_4_ * fVar373 * 4.0;
    auVar49._24_4_ = auVar105._24_4_ * fVar376 * 4.0;
    auVar49._28_4_ = 0x40800000;
    auVar29 = vsubps_avx(auVar48,auVar49);
    auVar104 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,5);
    auVar272._8_4_ = 0x7fffffff;
    auVar272._0_8_ = 0x7fffffff7fffffff;
    auVar272._12_4_ = 0x7fffffff;
    auVar272._16_4_ = 0x7fffffff;
    auVar272._20_4_ = 0x7fffffff;
    auVar272._24_4_ = 0x7fffffff;
    auVar272._28_4_ = 0x7fffffff;
    local_3a0 = vandps_avx(auVar47,auVar272);
    local_300._0_4_ = fVar326 + fVar326;
    local_300._4_4_ = fVar317 + fVar317;
    local_300._8_4_ = fVar367 + fVar367;
    local_300._12_4_ = fVar147 + fVar147;
    local_300._16_4_ = fVar370 + fVar370;
    local_300._20_4_ = fVar373 + fVar373;
    local_300._24_4_ = fVar376 + fVar376;
    local_300._28_4_ = auVar341._28_4_ + auVar341._28_4_;
    local_2c0 = vandps_avx(auVar341,auVar272);
    uVar85 = CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_2e0._0_8_ = uVar85 ^ 0x8000000080000000;
    local_2e0._8_4_ = -local_3c0._8_4_;
    local_2e0._12_4_ = -local_3c0._12_4_;
    local_2e0._16_4_ = -local_3c0._16_4_;
    local_2e0._20_4_ = -local_3c0._20_4_;
    local_2e0._24_4_ = -local_3c0._24_4_;
    local_2e0._28_4_ = -local_3c0._28_4_;
    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar104 >> 0x7f,0) == '\0') &&
          (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar104 >> 0xbf,0) == '\0') &&
        (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar104[0x1f])
    {
      auVar345 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar134._8_4_ = 0xff800000;
      auVar134._0_8_ = 0xff800000ff800000;
      auVar134._12_4_ = 0xff800000;
      auVar134._16_4_ = 0xff800000;
      auVar134._20_4_ = 0xff800000;
      auVar134._24_4_ = 0xff800000;
      auVar134._28_4_ = 0xff800000;
    }
    else {
      auVar302 = vsqrtps_avx(auVar29);
      auVar341 = vrcpps_avx(local_300);
      auVar30 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,5);
      fVar119 = auVar341._0_4_;
      fVar144 = auVar341._4_4_;
      auVar50._4_4_ = local_300._4_4_ * fVar144;
      auVar50._0_4_ = local_300._0_4_ * fVar119;
      fVar145 = auVar341._8_4_;
      auVar50._8_4_ = local_300._8_4_ * fVar145;
      fVar148 = auVar341._12_4_;
      auVar50._12_4_ = local_300._12_4_ * fVar148;
      fVar150 = auVar341._16_4_;
      auVar50._16_4_ = local_300._16_4_ * fVar150;
      fVar151 = auVar341._20_4_;
      auVar50._20_4_ = local_300._20_4_ * fVar151;
      fVar152 = auVar341._24_4_;
      auVar50._24_4_ = local_300._24_4_ * fVar152;
      auVar50._28_4_ = auVar29._28_4_;
      auVar106._8_4_ = 0x3f800000;
      auVar106._0_8_ = 0x3f8000003f800000;
      auVar106._12_4_ = 0x3f800000;
      auVar106._16_4_ = 0x3f800000;
      auVar106._20_4_ = 0x3f800000;
      auVar106._24_4_ = 0x3f800000;
      auVar106._28_4_ = 0x3f800000;
      auVar29 = vsubps_avx(auVar106,auVar50);
      fVar119 = fVar119 + fVar119 * auVar29._0_4_;
      fVar144 = fVar144 + fVar144 * auVar29._4_4_;
      fVar145 = fVar145 + fVar145 * auVar29._8_4_;
      fVar148 = fVar148 + fVar148 * auVar29._12_4_;
      fVar150 = fVar150 + fVar150 * auVar29._16_4_;
      fVar151 = fVar151 + fVar151 * auVar29._20_4_;
      fVar152 = fVar152 + fVar152 * auVar29._24_4_;
      auVar31 = vsubps_avx(local_2e0,auVar302);
      fVar252 = auVar31._0_4_ * fVar119;
      fVar261 = auVar31._4_4_ * fVar144;
      auVar51._4_4_ = fVar261;
      auVar51._0_4_ = fVar252;
      fVar263 = auVar31._8_4_ * fVar145;
      auVar51._8_4_ = fVar263;
      fVar265 = auVar31._12_4_ * fVar148;
      auVar51._12_4_ = fVar265;
      fVar266 = auVar31._16_4_ * fVar150;
      auVar51._16_4_ = fVar266;
      fVar267 = auVar31._20_4_ * fVar151;
      auVar51._20_4_ = fVar267;
      fVar268 = auVar31._24_4_ * fVar152;
      auVar51._24_4_ = fVar268;
      auVar51._28_4_ = auVar31._28_4_;
      auVar302 = vsubps_avx(auVar302,local_3c0);
      fVar119 = auVar302._0_4_ * fVar119;
      fVar144 = auVar302._4_4_ * fVar144;
      auVar52._4_4_ = fVar144;
      auVar52._0_4_ = fVar119;
      fVar145 = auVar302._8_4_ * fVar145;
      auVar52._8_4_ = fVar145;
      fVar148 = auVar302._12_4_ * fVar148;
      auVar52._12_4_ = fVar148;
      fVar150 = auVar302._16_4_ * fVar150;
      auVar52._16_4_ = fVar150;
      fVar151 = auVar302._20_4_ * fVar151;
      auVar52._20_4_ = fVar151;
      fVar152 = auVar302._24_4_ * fVar152;
      auVar52._24_4_ = fVar152;
      auVar52._28_4_ = auVar341._28_4_ + auVar29._28_4_;
      fStack_364 = local_680._28_4_ + auVar302._28_4_;
      local_380 = fVar174 * (local_680._0_4_ + local_660._0_4_ * fVar252);
      fStack_37c = fVar264 * (local_680._4_4_ + local_660._4_4_ * fVar261);
      fStack_378 = fVar228 * (local_680._8_4_ + local_660._8_4_ * fVar263);
      fStack_374 = fVar249 * (local_680._12_4_ + local_660._12_4_ * fVar265);
      fStack_370 = fVar307 * (local_680._16_4_ + local_660._16_4_ * fVar266);
      fStack_36c = fVar352 * (local_680._20_4_ + local_660._20_4_ * fVar267);
      fStack_368 = fVar314 * (local_680._24_4_ + local_660._24_4_ * fVar268);
      local_360 = fVar174 * (local_680._0_4_ + local_660._0_4_ * fVar119);
      fStack_35c = fVar264 * (local_680._4_4_ + local_660._4_4_ * fVar144);
      fStack_358 = fVar228 * (local_680._8_4_ + local_660._8_4_ * fVar145);
      fStack_354 = fVar249 * (local_680._12_4_ + local_660._12_4_ * fVar148);
      fStack_350 = fVar307 * (local_680._16_4_ + local_660._16_4_ * fVar150);
      fStack_34c = fVar352 * (local_680._20_4_ + local_660._20_4_ * fVar151);
      fStack_348 = fVar314 * (local_680._24_4_ + local_660._24_4_ * fVar152);
      fStack_344 = local_680._28_4_ + fStack_364;
      auVar239._8_4_ = 0x7f800000;
      auVar239._0_8_ = 0x7f8000007f800000;
      auVar239._12_4_ = 0x7f800000;
      auVar239._16_4_ = 0x7f800000;
      auVar239._20_4_ = 0x7f800000;
      auVar239._24_4_ = 0x7f800000;
      auVar239._28_4_ = 0x7f800000;
      auVar341 = vblendvps_avx(auVar239,auVar51,auVar30);
      auVar345 = ZEXT3264(auVar341);
      auVar240._8_4_ = 0xff800000;
      auVar240._0_8_ = 0xff800000ff800000;
      auVar240._12_4_ = 0xff800000;
      auVar240._16_4_ = 0xff800000;
      auVar240._20_4_ = 0xff800000;
      auVar240._24_4_ = 0xff800000;
      auVar240._28_4_ = 0xff800000;
      auVar134 = vblendvps_avx(auVar240,auVar52,auVar30);
      auVar29 = vmaxps_avx(local_600,local_3a0);
      auVar53._4_4_ = auVar29._4_4_ * 1.9073486e-06;
      auVar53._0_4_ = auVar29._0_4_ * 1.9073486e-06;
      auVar53._8_4_ = auVar29._8_4_ * 1.9073486e-06;
      auVar53._12_4_ = auVar29._12_4_ * 1.9073486e-06;
      auVar53._16_4_ = auVar29._16_4_ * 1.9073486e-06;
      auVar53._20_4_ = auVar29._20_4_ * 1.9073486e-06;
      auVar53._24_4_ = auVar29._24_4_ * 1.9073486e-06;
      auVar53._28_4_ = auVar29._28_4_;
      auVar29 = vcmpps_avx(local_2c0,auVar53,1);
      auVar302 = auVar30 & auVar29;
      if ((((((((auVar302 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar302 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar302 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar302 >> 0x7f,0) != '\0') ||
            (auVar302 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar302 >> 0xbf,0) != '\0') ||
          (auVar302 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar302[0x1f] < '\0') {
        auVar104 = vandps_avx(auVar29,auVar30);
        auVar192 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
        auVar29 = vcmpps_avx(auVar105,_DAT_01f7b000,2);
        auVar275._8_4_ = 0xff800000;
        auVar275._0_8_ = 0xff800000ff800000;
        auVar275._12_4_ = 0xff800000;
        auVar275._16_4_ = 0xff800000;
        auVar275._20_4_ = 0xff800000;
        auVar275._24_4_ = 0xff800000;
        auVar275._28_4_ = 0xff800000;
        auVar276._8_4_ = 0x7f800000;
        auVar276._0_8_ = 0x7f8000007f800000;
        auVar276._12_4_ = 0x7f800000;
        auVar276._16_4_ = 0x7f800000;
        auVar276._20_4_ = 0x7f800000;
        auVar276._24_4_ = 0x7f800000;
        auVar276._28_4_ = 0x7f800000;
        auVar105 = vblendvps_avx(auVar276,auVar275,auVar29);
        auVar207 = vpmovsxwd_avx(auVar192);
        auVar192 = vpunpckhwd_avx(auVar192,auVar192);
        auVar244._16_16_ = auVar192;
        auVar244._0_16_ = auVar207;
        auVar105 = vblendvps_avx(auVar341,auVar105,auVar244);
        auVar341 = vblendvps_avx(auVar275,auVar276,auVar29);
        auVar345 = ZEXT3264(auVar105);
        auVar134 = vblendvps_avx(auVar134,auVar341,auVar244);
        auVar222._0_8_ = auVar104._0_8_ ^ 0xffffffffffffffff;
        auVar222._8_4_ = auVar104._8_4_ ^ 0xffffffff;
        auVar222._12_4_ = auVar104._12_4_ ^ 0xffffffff;
        auVar222._16_4_ = auVar104._16_4_ ^ 0xffffffff;
        auVar222._20_4_ = auVar104._20_4_ ^ 0xffffffff;
        auVar222._24_4_ = auVar104._24_4_ ^ 0xffffffff;
        auVar222._28_4_ = auVar104._28_4_ ^ 0xffffffff;
        auVar104 = vorps_avx(auVar29,auVar222);
        auVar104 = vandps_avx(auVar30,auVar104);
      }
    }
    auVar293 = ZEXT3264(local_680);
    auVar105 = local_5e0 & auVar104;
    fVar119 = (float)local_a20._0_4_;
    fVar144 = (float)local_a20._4_4_;
    fVar145 = fStack_a18;
    fVar148 = fStack_a14;
    fVar150 = fStack_a10;
    fVar151 = fStack_a0c;
    fVar152 = fStack_a08;
    fVar252 = fStack_a04;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar105 >> 0x7f,0) != '\0') ||
          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar105 >> 0xbf,0) != '\0') ||
        (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar105[0x1f] < '\0') {
      auVar107 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x100));
      local_3e0 = auVar107;
      auVar192 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_9c0._0_4_));
      auVar192 = vshufps_avx(auVar192,auVar192,0);
      auVar241._16_16_ = auVar192;
      auVar241._0_16_ = auVar192;
      auVar30 = vminps_avx(auVar241,auVar134);
      auVar108._0_4_ =
           (float)local_960._0_4_ * fVar385 +
           (float)local_860._0_4_ * fVar336 + (float)local_880._0_4_ * fVar354;
      auVar108._4_4_ =
           (float)local_960._4_4_ * fVar387 +
           (float)local_860._4_4_ * fVar346 + (float)local_880._4_4_ * fVar362;
      auVar108._8_4_ = fStack_958 * fVar277 + fStack_858 * fVar347 + fStack_878 * fVar365;
      auVar108._12_4_ = fStack_954 * fVar279 + fStack_854 * fVar348 + fStack_874 * fVar368;
      auVar108._16_4_ = fStack_950 * fVar281 + fStack_850 * fVar349 + fStack_870 * fVar371;
      auVar108._20_4_ = fStack_94c * fVar283 + fStack_84c * fVar350 + fStack_86c * fVar374;
      auVar108._24_4_ = fStack_948 * fVar285 + fStack_848 * fVar351 + fStack_868 * fVar377;
      auVar108._28_4_ = fVar379 + fStack_1e4 + fVar379;
      auVar29 = vrcpps_avx(auVar108);
      fVar379 = auVar29._0_4_;
      fVar261 = auVar29._4_4_;
      auVar54._4_4_ = auVar108._4_4_ * fVar261;
      auVar54._0_4_ = auVar108._0_4_ * fVar379;
      fVar263 = auVar29._8_4_;
      auVar54._8_4_ = auVar108._8_4_ * fVar263;
      fVar265 = auVar29._12_4_;
      auVar54._12_4_ = auVar108._12_4_ * fVar265;
      fVar266 = auVar29._16_4_;
      auVar54._16_4_ = auVar108._16_4_ * fVar266;
      fVar267 = auVar29._20_4_;
      auVar54._20_4_ = auVar108._20_4_ * fVar267;
      fVar268 = auVar29._24_4_;
      auVar54._24_4_ = auVar108._24_4_ * fVar268;
      auVar54._28_4_ = fStack_a04 + auVar192._12_4_;
      auVar290._8_4_ = 0x3f800000;
      auVar290._0_8_ = 0x3f8000003f800000;
      auVar290._12_4_ = 0x3f800000;
      auVar290._16_4_ = 0x3f800000;
      auVar290._20_4_ = 0x3f800000;
      auVar290._24_4_ = 0x3f800000;
      auVar290._28_4_ = 0x3f800000;
      auVar302 = vsubps_avx(auVar290,auVar54);
      auVar273._8_4_ = 0x7fffffff;
      auVar273._0_8_ = 0x7fffffff7fffffff;
      auVar273._12_4_ = 0x7fffffff;
      auVar273._16_4_ = 0x7fffffff;
      auVar273._20_4_ = 0x7fffffff;
      auVar273._24_4_ = 0x7fffffff;
      auVar273._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(auVar108,auVar273);
      auVar389._8_4_ = 0x219392ef;
      auVar389._0_8_ = 0x219392ef219392ef;
      auVar389._12_4_ = 0x219392ef;
      auVar389._16_4_ = 0x219392ef;
      auVar389._20_4_ = 0x219392ef;
      auVar389._24_4_ = 0x219392ef;
      auVar389._28_4_ = 0x219392ef;
      auVar341 = vcmpps_avx(auVar105,auVar389,1);
      auVar55._4_4_ =
           (fVar261 + fVar261 * auVar302._4_4_) *
           -(fVar387 * fVar394 + fVar346 * fVar262 + fVar362 * fVar327);
      auVar55._0_4_ =
           (fVar379 + fVar379 * auVar302._0_4_) *
           -(fVar385 * fVar391 + fVar336 * fVar154 + fVar354 * fVar320);
      auVar55._8_4_ =
           (fVar263 + fVar263 * auVar302._8_4_) *
           -(fVar277 * fVar395 + fVar347 * fVar296 + fVar365 * fVar329);
      auVar55._12_4_ =
           (fVar265 + fVar265 * auVar302._12_4_) *
           -(fVar279 * fVar397 + fVar348 * fVar248 + fVar368 * fVar331);
      auVar55._16_4_ =
           (fVar266 + fVar266 * auVar302._16_4_) *
           -(fVar281 * fVar398 + fVar349 * fVar305 + fVar371 * fVar332);
      auVar55._20_4_ =
           (fVar267 + fVar267 * auVar302._20_4_) *
           -(fVar283 * fVar399 + fVar350 * fVar335 + fVar374 * fVar333);
      auVar55._24_4_ =
           (fVar268 + fVar268 * auVar302._24_4_) *
           -(fVar285 * fVar400 + fVar351 * fVar311 + fVar377 * fVar334);
      auVar55._28_4_ = auVar29._28_4_ + auVar302._28_4_;
      auVar302 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar105 = vcmpps_avx(auVar108,auVar302,1);
      auVar105 = vorps_avx(auVar341,auVar105);
      auVar360._8_4_ = 0xff800000;
      auVar360._0_8_ = 0xff800000ff800000;
      auVar360._12_4_ = 0xff800000;
      auVar360._16_4_ = 0xff800000;
      auVar360._20_4_ = 0xff800000;
      auVar360._24_4_ = 0xff800000;
      auVar360._28_4_ = 0xff800000;
      auVar105 = vblendvps_avx(auVar55,auVar360,auVar105);
      auVar29 = vcmpps_avx(auVar108,auVar302,6);
      auVar341 = vorps_avx(auVar341,auVar29);
      auVar382._8_4_ = 0x7f800000;
      auVar382._0_8_ = 0x7f8000007f800000;
      auVar382._12_4_ = 0x7f800000;
      auVar382._16_4_ = 0x7f800000;
      auVar382._20_4_ = 0x7f800000;
      auVar382._24_4_ = 0x7f800000;
      auVar382._28_4_ = 0x7f800000;
      auVar341 = vblendvps_avx(auVar55,auVar382,auVar341);
      auVar29 = vmaxps_avx(local_340,auVar345._0_32_);
      auVar29 = vmaxps_avx(auVar29,auVar105);
      auVar341 = vminps_avx(auVar30,auVar341);
      auVar293 = ZEXT3264(auVar341);
      auVar105 = vsubps_avx(auVar302,auVar21);
      auVar21 = vsubps_avx(auVar302,auVar22);
      auVar56._4_4_ = auVar21._4_4_ * -fVar363;
      auVar56._0_4_ = auVar21._0_4_ * -fVar355;
      auVar56._8_4_ = auVar21._8_4_ * -fVar366;
      auVar56._12_4_ = auVar21._12_4_ * -fVar369;
      auVar56._16_4_ = auVar21._16_4_ * -fVar372;
      auVar56._20_4_ = auVar21._20_4_ * -fVar375;
      auVar56._24_4_ = auVar21._24_4_ * -fVar378;
      auVar56._28_4_ = auVar21._28_4_;
      auVar57._4_4_ = fVar380 * auVar105._4_4_;
      auVar57._0_4_ = fVar155 * auVar105._0_4_;
      auVar57._8_4_ = fVar176 * auVar105._8_4_;
      auVar57._12_4_ = fVar383 * auVar105._12_4_;
      auVar57._16_4_ = fVar179 * auVar105._16_4_;
      auVar57._20_4_ = fVar384 * auVar105._20_4_;
      auVar57._24_4_ = fVar182 * auVar105._24_4_;
      auVar57._28_4_ = auVar105._28_4_;
      auVar105 = vsubps_avx(auVar56,auVar57);
      auVar21 = vsubps_avx(auVar302,auVar24);
      auVar58._4_4_ = fVar388 * auVar21._4_4_;
      auVar58._0_4_ = fVar386 * auVar21._0_4_;
      auVar58._8_4_ = fVar278 * auVar21._8_4_;
      auVar58._12_4_ = fVar280 * auVar21._12_4_;
      auVar58._16_4_ = fVar282 * auVar21._16_4_;
      auVar58._20_4_ = fVar284 * auVar21._20_4_;
      uVar90 = auVar21._28_4_;
      auVar58._24_4_ = fVar286 * auVar21._24_4_;
      auVar58._28_4_ = uVar90;
      auVar24 = vsubps_avx(auVar105,auVar58);
      auVar59._4_4_ = (float)local_880._4_4_ * -fVar363;
      auVar59._0_4_ = (float)local_880._0_4_ * -fVar355;
      auVar59._8_4_ = fStack_878 * -fVar366;
      auVar59._12_4_ = fStack_874 * -fVar369;
      auVar59._16_4_ = fStack_870 * -fVar372;
      auVar59._20_4_ = fStack_86c * -fVar375;
      auVar59._24_4_ = fStack_868 * -fVar378;
      auVar59._28_4_ = uVar91 ^ 0x80000000;
      auVar342._8_4_ = 0x3f800000;
      auVar342._0_8_ = 0x3f8000003f800000;
      auVar342._12_4_ = 0x3f800000;
      auVar342._16_4_ = 0x3f800000;
      auVar342._20_4_ = 0x3f800000;
      auVar342._24_4_ = 0x3f800000;
      auVar342._28_4_ = 0x3f800000;
      auVar345 = ZEXT3264(auVar342);
      auVar60._4_4_ = (float)local_860._4_4_ * fVar380;
      auVar60._0_4_ = (float)local_860._0_4_ * fVar155;
      auVar60._8_4_ = fStack_858 * fVar176;
      auVar60._12_4_ = fStack_854 * fVar383;
      auVar60._16_4_ = fStack_850 * fVar179;
      auVar60._20_4_ = fStack_84c * fVar384;
      auVar60._24_4_ = fStack_848 * fVar182;
      auVar60._28_4_ = uVar90;
      auVar105 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = (float)local_960._4_4_ * fVar388;
      auVar61._0_4_ = (float)local_960._0_4_ * fVar386;
      auVar61._8_4_ = fStack_958 * fVar278;
      auVar61._12_4_ = fStack_954 * fVar280;
      auVar61._16_4_ = fStack_950 * fVar282;
      auVar61._20_4_ = fStack_94c * fVar284;
      auVar61._24_4_ = fStack_948 * fVar286;
      auVar61._28_4_ = uVar90;
      auVar30 = vsubps_avx(auVar105,auVar61);
      auVar105 = vrcpps_avx(auVar30);
      fVar154 = auVar105._0_4_;
      fVar262 = auVar105._4_4_;
      auVar62._4_4_ = auVar30._4_4_ * fVar262;
      auVar62._0_4_ = auVar30._0_4_ * fVar154;
      fVar296 = auVar105._8_4_;
      auVar62._8_4_ = auVar30._8_4_ * fVar296;
      fVar248 = auVar105._12_4_;
      auVar62._12_4_ = auVar30._12_4_ * fVar248;
      fVar305 = auVar105._16_4_;
      auVar62._16_4_ = auVar30._16_4_ * fVar305;
      fVar335 = auVar105._20_4_;
      auVar62._20_4_ = auVar30._20_4_ * fVar335;
      fVar311 = auVar105._24_4_;
      auVar62._24_4_ = auVar30._24_4_ * fVar311;
      auVar62._28_4_ = fStack_944;
      auVar302 = vsubps_avx(auVar342,auVar62);
      auVar105 = vandps_avx(auVar30,auVar273);
      auVar109._8_4_ = 0x219392ef;
      auVar109._0_8_ = 0x219392ef219392ef;
      auVar109._12_4_ = 0x219392ef;
      auVar109._16_4_ = 0x219392ef;
      auVar109._20_4_ = 0x219392ef;
      auVar109._24_4_ = 0x219392ef;
      auVar109._28_4_ = 0x219392ef;
      auVar21 = vcmpps_avx(auVar105,auVar109,1);
      auVar63._4_4_ = (fVar262 + fVar262 * auVar302._4_4_) * -auVar24._4_4_;
      auVar63._0_4_ = (fVar154 + fVar154 * auVar302._0_4_) * -auVar24._0_4_;
      auVar63._8_4_ = (fVar296 + fVar296 * auVar302._8_4_) * -auVar24._8_4_;
      auVar63._12_4_ = (fVar248 + fVar248 * auVar302._12_4_) * -auVar24._12_4_;
      auVar63._16_4_ = (fVar305 + fVar305 * auVar302._16_4_) * -auVar24._16_4_;
      auVar63._20_4_ = (fVar335 + fVar335 * auVar302._20_4_) * -auVar24._20_4_;
      auVar63._24_4_ = (fVar311 + fVar311 * auVar302._24_4_) * -auVar24._24_4_;
      auVar63._28_4_ = auVar24._28_4_ ^ 0x80000000;
      auVar105 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,1);
      auVar105 = vorps_avx(auVar21,auVar105);
      auVar105 = vblendvps_avx(auVar63,auVar360,auVar105);
      local_980 = vmaxps_avx(auVar29,auVar105);
      auVar105 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,6);
      auVar105 = vorps_avx(auVar21,auVar105);
      auVar105 = vblendvps_avx(auVar63,auVar382,auVar105);
      auVar104 = vandps_avx(auVar104,local_5e0);
      local_400 = vminps_avx(auVar341,auVar105);
      auVar105 = vcmpps_avx(local_980,local_400,2);
      auVar21 = auVar104 & auVar105;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar21 = vminps_avx(auVar238,auVar133);
        auVar23 = vminps_avx(auVar23,auVar26);
        auVar21 = vminps_avx(auVar21,auVar23);
        auVar25 = vsubps_avx(auVar21,auVar25);
        auVar104 = vandps_avx(auVar105,auVar104);
        auVar80._4_4_ = fStack_37c;
        auVar80._0_4_ = local_380;
        auVar80._8_4_ = fStack_378;
        auVar80._12_4_ = fStack_374;
        auVar80._16_4_ = fStack_370;
        auVar80._20_4_ = fStack_36c;
        auVar80._24_4_ = fStack_368;
        auVar80._28_4_ = fStack_364;
        auVar105 = vminps_avx(auVar80,auVar342);
        auVar216 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar105 = vmaxps_avx(auVar105,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar223 + fVar226 * (auVar105._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar224 + fVar227 * (auVar105._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar225 + fVar392 * (auVar105._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_ac4 + fVar396 * (auVar105._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar223 + fVar226 * (auVar105._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar224 + fVar227 * (auVar105._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar225 + fVar392 * (auVar105._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_ac4 + auVar105._28_4_ + 7.0;
        auVar81._4_4_ = fStack_35c;
        auVar81._0_4_ = local_360;
        auVar81._8_4_ = fStack_358;
        auVar81._12_4_ = fStack_354;
        auVar81._16_4_ = fStack_350;
        auVar81._20_4_ = fStack_34c;
        auVar81._24_4_ = fStack_348;
        auVar81._28_4_ = fStack_344;
        auVar105 = vminps_avx(auVar81,auVar342);
        auVar105 = vmaxps_avx(auVar105,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar223 + fVar226 * (auVar105._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar224 + fVar227 * (auVar105._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar225 + fVar392 * (auVar105._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_ac4 + fVar396 * (auVar105._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar223 + fVar226 * (auVar105._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar224 + fVar227 * (auVar105._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar225 + fVar392 * (auVar105._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_ac4 + auVar105._28_4_ + 7.0;
        auVar64._4_4_ = auVar25._4_4_ * 0.99999976;
        auVar64._0_4_ = auVar25._0_4_ * 0.99999976;
        auVar64._8_4_ = auVar25._8_4_ * 0.99999976;
        auVar64._12_4_ = auVar25._12_4_ * 0.99999976;
        auVar64._16_4_ = auVar25._16_4_ * 0.99999976;
        auVar64._20_4_ = auVar25._20_4_ * 0.99999976;
        auVar64._24_4_ = auVar25._24_4_ * 0.99999976;
        auVar64._28_4_ = 0x3f7ffffc;
        auVar105 = vmaxps_avx(ZEXT832(0) << 0x20,auVar64);
        auVar65._4_4_ = auVar105._4_4_ * auVar105._4_4_;
        auVar65._0_4_ = auVar105._0_4_ * auVar105._0_4_;
        auVar65._8_4_ = auVar105._8_4_ * auVar105._8_4_;
        auVar65._12_4_ = auVar105._12_4_ * auVar105._12_4_;
        auVar65._16_4_ = auVar105._16_4_ * auVar105._16_4_;
        auVar65._20_4_ = auVar105._20_4_ * auVar105._20_4_;
        auVar65._24_4_ = auVar105._24_4_ * auVar105._24_4_;
        auVar65._28_4_ = auVar105._28_4_;
        auVar25 = vsubps_avx(auVar28,auVar65);
        auVar66._4_4_ = auVar25._4_4_ * fVar317 * 4.0;
        auVar66._0_4_ = auVar25._0_4_ * fVar326 * 4.0;
        auVar66._8_4_ = auVar25._8_4_ * fVar367 * 4.0;
        auVar66._12_4_ = auVar25._12_4_ * fVar147 * 4.0;
        auVar66._16_4_ = auVar25._16_4_ * fVar370 * 4.0;
        auVar66._20_4_ = auVar25._20_4_ * fVar373 * 4.0;
        auVar66._24_4_ = auVar25._24_4_ * fVar376 * 4.0;
        auVar66._28_4_ = auVar105._28_4_;
        auVar21 = vsubps_avx(auVar48,auVar66);
        local_9e0 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,5);
        auVar105 = local_9e0;
        if ((((((((local_9e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_9e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_9e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_9e0 >> 0x7f,0) == '\0') &&
              (local_9e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_9e0 >> 0xbf,0) == '\0') &&
            (local_9e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_9e0[0x1f]) {
          auVar271 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar257 = ZEXT828(0) << 0x20;
          local_be0 = 0.0;
          fStack_bdc = 0.0;
          fStack_bd8 = 0.0;
          fStack_bd4 = 0.0;
          fStack_bd0 = 0.0;
          fStack_bcc = 0.0;
          fStack_bc8 = 0.0;
          fStack_bc4 = 0.0;
          auVar236 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_c60 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar291._8_4_ = 0x7f800000;
          auVar291._0_8_ = 0x7f8000007f800000;
          auVar291._12_4_ = 0x7f800000;
          auVar291._16_4_ = 0x7f800000;
          auVar291._20_4_ = 0x7f800000;
          auVar291._24_4_ = 0x7f800000;
          auVar291._28_4_ = 0x7f800000;
          auVar343._8_4_ = 0xff800000;
          auVar343._0_8_ = 0xff800000ff800000;
          auVar343._12_4_ = 0xff800000;
          auVar343._16_4_ = 0xff800000;
          auVar343._20_4_ = 0xff800000;
          auVar343._24_4_ = 0xff800000;
          auVar343._28_4_ = 0xff800000;
          auVar16 = auVar25;
          _local_ae0 = auVar22;
          local_9e0 = auVar32;
        }
        else {
          auVar22 = vrcpps_avx(local_300);
          fVar326 = auVar22._0_4_;
          auVar217._0_4_ = local_300._0_4_ * fVar326;
          fVar154 = auVar22._4_4_;
          auVar217._4_4_ = local_300._4_4_ * fVar154;
          fVar262 = auVar22._8_4_;
          auVar217._8_4_ = local_300._8_4_ * fVar262;
          fVar296 = auVar22._12_4_;
          auVar217._12_4_ = local_300._12_4_ * fVar296;
          fVar248 = auVar22._16_4_;
          auVar217._16_4_ = local_300._16_4_ * fVar248;
          fVar305 = auVar22._20_4_;
          auVar217._20_4_ = local_300._20_4_ * fVar305;
          fVar335 = auVar22._24_4_;
          auVar217._24_4_ = local_300._24_4_ * fVar335;
          auVar217._28_4_ = 0;
          auVar24 = vsubps_avx(auVar342,auVar217);
          auVar23 = vsqrtps_avx(auVar21);
          fVar326 = fVar326 + fVar326 * auVar24._0_4_;
          fVar154 = fVar154 + fVar154 * auVar24._4_4_;
          fVar262 = fVar262 + fVar262 * auVar24._8_4_;
          fVar296 = fVar296 + fVar296 * auVar24._12_4_;
          fVar248 = fVar248 + fVar248 * auVar24._16_4_;
          fVar305 = fVar305 + fVar305 * auVar24._20_4_;
          fVar335 = fVar335 + fVar335 * auVar24._24_4_;
          auVar26 = vsubps_avx(local_2e0,auVar23);
          fVar392 = auVar26._0_4_ * fVar326;
          fVar367 = auVar26._4_4_ * fVar154;
          auVar67._4_4_ = fVar367;
          auVar67._0_4_ = fVar392;
          fVar396 = auVar26._8_4_ * fVar262;
          auVar67._8_4_ = fVar396;
          fVar147 = auVar26._12_4_ * fVar296;
          auVar67._12_4_ = fVar147;
          fVar370 = auVar26._16_4_ * fVar248;
          auVar67._16_4_ = fVar370;
          fVar373 = auVar26._20_4_ * fVar305;
          auVar67._20_4_ = fVar373;
          fVar376 = auVar26._24_4_ * fVar335;
          auVar67._24_4_ = fVar376;
          auVar67._28_4_ = auVar104._28_4_;
          auVar26 = vsubps_avx(auVar23,local_3c0);
          fVar326 = auVar26._0_4_ * fVar326;
          fVar154 = auVar26._4_4_ * fVar154;
          auVar68._4_4_ = fVar154;
          auVar68._0_4_ = fVar326;
          fVar262 = auVar26._8_4_ * fVar262;
          auVar68._8_4_ = fVar262;
          fVar296 = auVar26._12_4_ * fVar296;
          auVar68._12_4_ = fVar296;
          fVar248 = auVar26._16_4_ * fVar248;
          auVar68._16_4_ = fVar248;
          fVar305 = auVar26._20_4_ * fVar305;
          auVar68._20_4_ = fVar305;
          fVar335 = auVar26._24_4_ * fVar335;
          auVar68._24_4_ = fVar335;
          auVar68._28_4_ = 0x80000000;
          fVar311 = fVar174 * (fVar392 * local_660._0_4_ + local_680._0_4_);
          fVar223 = fVar264 * (fVar367 * local_660._4_4_ + local_680._4_4_);
          fVar224 = fVar228 * (fVar396 * local_660._8_4_ + local_680._8_4_);
          fVar225 = fVar249 * (fVar147 * local_660._12_4_ + local_680._12_4_);
          fVar226 = fVar307 * (fVar370 * local_660._16_4_ + local_680._16_4_);
          fVar227 = fVar352 * (fVar373 * local_660._20_4_ + local_680._20_4_);
          fVar317 = fVar314 * (fVar376 * local_660._24_4_ + local_680._24_4_);
          auVar135._0_4_ = local_a00 + fVar311 * fVar146;
          auVar135._4_4_ = fStack_9fc + fVar223 * fVar260;
          auVar135._8_4_ = fStack_9f8 + fVar224 * fVar295;
          auVar135._12_4_ = fStack_9f4 + fVar225 * fVar247;
          auVar135._16_4_ = fStack_9f0 + fVar226 * fVar303;
          auVar135._20_4_ = fStack_9ec + fVar227 * fVar315;
          auVar135._24_4_ = fStack_9e8 + fVar317 * fVar364;
          auVar135._28_4_ = fStack_9e4 + auVar22._28_4_ + auVar24._28_4_ + local_680._28_4_;
          auVar69._4_4_ = fVar367 * (float)local_960._4_4_;
          auVar69._0_4_ = fVar392 * (float)local_960._0_4_;
          auVar69._8_4_ = fVar396 * fStack_958;
          auVar69._12_4_ = fVar147 * fStack_954;
          auVar69._16_4_ = fVar370 * fStack_950;
          auVar69._20_4_ = fVar373 * fStack_94c;
          auVar69._24_4_ = fVar376 * fStack_948;
          auVar69._28_4_ = auVar23._28_4_;
          auVar24 = vsubps_avx(auVar69,auVar135);
          auVar16._4_4_ = fVar304;
          auVar16._0_4_ = fVar298;
          auVar16._8_4_ = fVar306;
          auVar16._12_4_ = fVar308;
          auVar16._16_4_ = fVar310;
          auVar16._20_4_ = fVar313;
          auVar16._24_4_ = fVar316;
          auVar16._28_4_ = fVar318;
          auVar242._0_4_ = fVar298 + fVar328 * fVar311;
          auVar242._4_4_ = fVar304 + fVar149 * fVar223;
          auVar242._8_4_ = fVar306 + fVar287 * fVar224;
          auVar242._12_4_ = fVar308 + fVar245 * fVar225;
          auVar242._16_4_ = fVar310 + fVar250 * fVar226;
          auVar242._20_4_ = fVar313 + fVar309 * fVar227;
          auVar242._24_4_ = fVar316 + fVar353 * fVar317;
          auVar242._28_4_ = fVar318 + auVar23._28_4_;
          auVar70._4_4_ = (float)local_860._4_4_ * fVar367;
          auVar70._0_4_ = (float)local_860._0_4_ * fVar392;
          auVar70._8_4_ = fStack_858 * fVar396;
          auVar70._12_4_ = fStack_854 * fVar147;
          auVar70._16_4_ = fStack_850 * fVar370;
          auVar70._20_4_ = fStack_84c * fVar373;
          auVar70._24_4_ = fStack_848 * fVar376;
          auVar70._28_4_ = 0x3e000000;
          auVar23 = vsubps_avx(auVar70,auVar242);
          auVar218._0_4_ = fVar153 + fVar330 * fVar311;
          auVar218._4_4_ = fVar173 + fVar251 * fVar223;
          auVar218._8_4_ = fVar175 + fVar294 * fVar224;
          auVar218._12_4_ = fVar177 + fVar246 * fVar225;
          auVar218._16_4_ = fVar178 + fVar297 * fVar226;
          auVar218._20_4_ = fVar180 + fVar312 * fVar227;
          auVar218._24_4_ = fVar181 + fVar361 * fVar317;
          auVar218._28_4_ = fVar183 + auVar26._28_4_;
          auVar71._4_4_ = (float)local_880._4_4_ * fVar367;
          auVar71._0_4_ = (float)local_880._0_4_ * fVar392;
          auVar71._8_4_ = fStack_878 * fVar396;
          auVar71._12_4_ = fStack_874 * fVar147;
          auVar71._16_4_ = fStack_870 * fVar370;
          auVar71._20_4_ = fStack_86c * fVar373;
          auVar71._24_4_ = fStack_868 * fVar376;
          auVar71._28_4_ = 0x3e000000;
          auVar22 = vsubps_avx(auVar71,auVar218);
          _local_c60 = auVar22._0_28_;
          fVar174 = fVar174 * (fVar326 * local_660._0_4_ + local_680._0_4_);
          fVar264 = fVar264 * (fVar154 * local_660._4_4_ + local_680._4_4_);
          fVar228 = fVar228 * (fVar262 * local_660._8_4_ + local_680._8_4_);
          fVar249 = fVar249 * (fVar296 * local_660._12_4_ + local_680._12_4_);
          fVar307 = fVar307 * (fVar248 * local_660._16_4_ + local_680._16_4_);
          fVar352 = fVar352 * (fVar305 * local_660._20_4_ + local_680._20_4_);
          fVar314 = fVar314 * (fVar335 * local_660._24_4_ + local_680._24_4_);
          auVar219._0_4_ = local_a00 + fVar174 * fVar146;
          auVar219._4_4_ = fStack_9fc + fVar264 * fVar260;
          auVar219._8_4_ = fStack_9f8 + fVar228 * fVar295;
          auVar219._12_4_ = fStack_9f4 + fVar249 * fVar247;
          auVar219._16_4_ = fStack_9f0 + fVar307 * fVar303;
          auVar219._20_4_ = fStack_9ec + fVar352 * fVar315;
          auVar219._24_4_ = fStack_9e8 + fVar314 * fVar364;
          auVar219._28_4_ = fStack_9e4 + auVar22._28_4_ + local_680._28_4_;
          auVar72._4_4_ = fVar154 * (float)local_960._4_4_;
          auVar72._0_4_ = fVar326 * (float)local_960._0_4_;
          auVar72._8_4_ = fVar262 * fStack_958;
          auVar72._12_4_ = fVar296 * fStack_954;
          auVar72._16_4_ = fVar248 * fStack_950;
          auVar72._20_4_ = fVar305 * fStack_94c;
          auVar72._24_4_ = fVar335 * fStack_948;
          auVar72._28_4_ = fStack_944;
          auVar22 = vsubps_avx(auVar72,auVar219);
          auVar216 = auVar22._0_28_;
          auVar274._0_4_ = fVar298 + fVar328 * fVar174;
          auVar274._4_4_ = fVar304 + fVar149 * fVar264;
          auVar274._8_4_ = fVar306 + fVar287 * fVar228;
          auVar274._12_4_ = fVar308 + fVar245 * fVar249;
          auVar274._16_4_ = fVar310 + fVar250 * fVar307;
          auVar274._20_4_ = fVar313 + fVar309 * fVar352;
          auVar274._24_4_ = fVar316 + fVar353 * fVar314;
          auVar274._28_4_ = fVar318 + fStack_944;
          auVar73._4_4_ = (float)local_860._4_4_ * fVar154;
          auVar73._0_4_ = (float)local_860._0_4_ * fVar326;
          auVar73._8_4_ = fStack_858 * fVar262;
          auVar73._12_4_ = fStack_854 * fVar296;
          auVar73._16_4_ = fStack_850 * fVar248;
          auVar73._20_4_ = fStack_84c * fVar305;
          auVar73._24_4_ = fStack_848 * fVar335;
          auVar73._28_4_ = fStack_844;
          auVar22 = vsubps_avx(auVar73,auVar274);
          auVar271 = auVar22._0_28_;
          auVar258._0_4_ = fVar153 + fVar330 * fVar174;
          auVar258._4_4_ = fVar173 + fVar251 * fVar264;
          auVar258._8_4_ = fVar175 + fVar294 * fVar228;
          auVar258._12_4_ = fVar177 + fVar246 * fVar249;
          auVar258._16_4_ = fVar178 + fVar297 * fVar307;
          auVar258._20_4_ = fVar180 + fVar312 * fVar352;
          auVar258._24_4_ = fVar181 + fVar361 * fVar314;
          auVar258._28_4_ = fVar183 + 0.125;
          auVar74._4_4_ = (float)local_880._4_4_ * fVar154;
          auVar74._0_4_ = (float)local_880._0_4_ * fVar326;
          auVar74._8_4_ = fStack_878 * fVar262;
          auVar74._12_4_ = fStack_874 * fVar296;
          auVar74._16_4_ = fStack_870 * fVar248;
          auVar74._20_4_ = fStack_86c * fVar305;
          auVar74._24_4_ = fStack_868 * fVar335;
          auVar74._28_4_ = fStack_844;
          auVar22 = vsubps_avx(auVar74,auVar258);
          auVar257 = auVar22._0_28_;
          auVar21 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,5);
          auVar292._8_4_ = 0x7f800000;
          auVar292._0_8_ = 0x7f8000007f800000;
          auVar292._12_4_ = 0x7f800000;
          auVar292._16_4_ = 0x7f800000;
          auVar292._20_4_ = 0x7f800000;
          auVar292._24_4_ = 0x7f800000;
          auVar292._28_4_ = 0x7f800000;
          auVar291 = vblendvps_avx(auVar292,auVar67,auVar21);
          auVar22 = vmaxps_avx(local_600,local_3a0);
          auVar75._4_4_ = auVar22._4_4_ * 1.9073486e-06;
          auVar75._0_4_ = auVar22._0_4_ * 1.9073486e-06;
          auVar75._8_4_ = auVar22._8_4_ * 1.9073486e-06;
          auVar75._12_4_ = auVar22._12_4_ * 1.9073486e-06;
          auVar75._16_4_ = auVar22._16_4_ * 1.9073486e-06;
          auVar75._20_4_ = auVar22._20_4_ * 1.9073486e-06;
          auVar75._24_4_ = auVar22._24_4_ * 1.9073486e-06;
          auVar75._28_4_ = auVar22._28_4_;
          auVar22 = vcmpps_avx(local_2c0,auVar75,1);
          auVar344._8_4_ = 0xff800000;
          auVar344._0_8_ = 0xff800000ff800000;
          auVar344._12_4_ = 0xff800000;
          auVar344._16_4_ = 0xff800000;
          auVar344._20_4_ = 0xff800000;
          auVar344._24_4_ = 0xff800000;
          auVar344._28_4_ = 0xff800000;
          auVar343 = vblendvps_avx(auVar344,auVar68,auVar21);
          auVar26 = auVar21 & auVar22;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0x7f,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0xbf,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar26[0x1f] < '\0') {
            auVar105 = vandps_avx(auVar22,auVar21);
            auVar192 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
            auVar22 = vcmpps_avx(auVar25,_DAT_01f7b000,2);
            auVar143._8_4_ = 0xff800000;
            auVar143._0_8_ = 0xff800000ff800000;
            auVar143._12_4_ = 0xff800000;
            auVar143._16_4_ = 0xff800000;
            auVar143._20_4_ = 0xff800000;
            auVar143._24_4_ = 0xff800000;
            auVar143._28_4_ = 0xff800000;
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar25 = vblendvps_avx(auVar172,auVar143,auVar22);
            auVar207 = vpmovsxwd_avx(auVar192);
            auVar192 = vpunpckhwd_avx(auVar192,auVar192);
            auVar390._16_16_ = auVar192;
            auVar390._0_16_ = auVar207;
            auVar291 = vblendvps_avx(auVar291,auVar25,auVar390);
            auVar25 = vblendvps_avx(auVar143,auVar172,auVar22);
            auVar343 = vblendvps_avx(auVar343,auVar25,auVar390);
            auVar203._0_8_ = auVar105._0_8_ ^ 0xffffffffffffffff;
            auVar203._8_4_ = auVar105._8_4_ ^ 0xffffffff;
            auVar203._12_4_ = auVar105._12_4_ ^ 0xffffffff;
            auVar203._16_4_ = auVar105._16_4_ ^ 0xffffffff;
            auVar203._20_4_ = auVar105._20_4_ ^ 0xffffffff;
            auVar203._24_4_ = auVar105._24_4_ ^ 0xffffffff;
            auVar203._28_4_ = auVar105._28_4_ ^ 0xffffffff;
            auVar16 = vorps_avx(auVar22,auVar203);
            auVar105 = vandps_avx(auVar21,auVar16);
          }
          local_be0 = auVar24._0_4_;
          fStack_bdc = auVar24._4_4_;
          fStack_bd8 = auVar24._8_4_;
          fStack_bd4 = auVar24._12_4_;
          fStack_bd0 = auVar24._16_4_;
          fStack_bcc = auVar24._20_4_;
          fStack_bc8 = auVar24._24_4_;
          fStack_bc4 = auVar24._28_4_;
          auVar236 = auVar23._0_28_;
          _local_ae0 = auVar104;
        }
        _local_460 = local_980;
        local_440 = vminps_avx(local_400,auVar291);
        _local_900 = vmaxps_avx(local_980,auVar343);
        auVar345 = ZEXT3264(_local_900);
        _local_420 = _local_900;
        auVar25 = vcmpps_avx(local_980,local_440,2);
        auVar293 = ZEXT3264(auVar25);
        local_7e0 = vandps_avx(auVar25,auVar104);
        auVar25 = vcmpps_avx(_local_900,local_400,2);
        local_920 = vandps_avx(auVar104,auVar25);
        auVar104 = vorps_avx(local_920,local_7e0);
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0x7f,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar104 >> 0xbf,0) != '\0') ||
            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar104[0x1f] < '\0') {
          auStack_998 = auVar133._8_24_;
          auVar293 = ZEXT3264(_local_860);
          auVar345 = ZEXT3264(local_7e0);
          auVar166._0_8_ = auVar105._0_8_ ^ 0xffffffffffffffff;
          auVar166._8_4_ = auVar105._8_4_ ^ 0xffffffff;
          auVar166._12_4_ = auVar105._12_4_ ^ 0xffffffff;
          auVar166._16_4_ = auVar105._16_4_ ^ 0xffffffff;
          auVar166._20_4_ = auVar105._20_4_ ^ 0xffffffff;
          auVar166._24_4_ = auVar105._24_4_ ^ 0xffffffff;
          auVar166._28_4_ = auVar105._28_4_ ^ 0xffffffff;
          auVar110._0_4_ =
               (float)local_960._0_4_ * auVar216._0_4_ +
               (float)local_860._0_4_ * auVar271._0_4_ + (float)local_880._0_4_ * auVar257._0_4_;
          auVar110._4_4_ =
               (float)local_960._4_4_ * auVar216._4_4_ +
               (float)local_860._4_4_ * auVar271._4_4_ + (float)local_880._4_4_ * auVar257._4_4_;
          auVar110._8_4_ =
               fStack_958 * auVar216._8_4_ +
               fStack_858 * auVar271._8_4_ + fStack_878 * auVar257._8_4_;
          auVar110._12_4_ =
               fStack_954 * auVar216._12_4_ +
               fStack_854 * auVar271._12_4_ + fStack_874 * auVar257._12_4_;
          auVar110._16_4_ =
               fStack_950 * auVar216._16_4_ +
               fStack_850 * auVar271._16_4_ + fStack_870 * auVar257._16_4_;
          auVar110._20_4_ =
               fStack_94c * auVar216._20_4_ +
               fStack_84c * auVar271._20_4_ + fStack_86c * auVar257._20_4_;
          auVar110._24_4_ =
               fStack_948 * auVar216._24_4_ +
               fStack_848 * auVar271._24_4_ + fStack_868 * auVar257._24_4_;
          auVar110._28_4_ = auVar16._28_4_ + local_7e0._28_4_ + auVar104._28_4_;
          auVar220._8_4_ = 0x7fffffff;
          auVar220._0_8_ = 0x7fffffff7fffffff;
          auVar220._12_4_ = 0x7fffffff;
          auVar220._16_4_ = 0x7fffffff;
          auVar220._20_4_ = 0x7fffffff;
          auVar220._24_4_ = 0x7fffffff;
          auVar220._28_4_ = 0x7fffffff;
          auVar104 = vandps_avx(auVar110,auVar220);
          auVar259._8_4_ = 0x3e99999a;
          auVar259._0_8_ = 0x3e99999a3e99999a;
          auVar259._12_4_ = 0x3e99999a;
          auVar259._16_4_ = 0x3e99999a;
          auVar259._20_4_ = 0x3e99999a;
          auVar259._24_4_ = 0x3e99999a;
          auVar259._28_4_ = 0x3e99999a;
          auVar104 = vcmpps_avx(auVar104,auVar259,1);
          local_820 = vorps_avx(auVar104,auVar166);
          auVar111._0_4_ =
               (float)local_960._0_4_ * local_be0 +
               (float)local_860._0_4_ * auVar236._0_4_ +
               (float)local_880._0_4_ * (float)local_c60._0_4_;
          auVar111._4_4_ =
               (float)local_960._4_4_ * fStack_bdc +
               (float)local_860._4_4_ * auVar236._4_4_ +
               (float)local_880._4_4_ * (float)local_c60._4_4_;
          auVar111._8_4_ =
               fStack_958 * fStack_bd8 + fStack_858 * auVar236._8_4_ + fStack_878 * fStack_c58;
          auVar111._12_4_ =
               fStack_954 * fStack_bd4 + fStack_854 * auVar236._12_4_ + fStack_874 * fStack_c54;
          auVar111._16_4_ =
               fStack_950 * fStack_bd0 + fStack_850 * auVar236._16_4_ + fStack_870 * fStack_c50;
          auVar111._20_4_ =
               fStack_94c * fStack_bcc + fStack_84c * auVar236._20_4_ + fStack_86c * fStack_c4c;
          auVar111._24_4_ =
               fStack_948 * fStack_bc8 + fStack_848 * auVar236._24_4_ + fStack_868 * fStack_c48;
          auVar111._28_4_ = local_820._28_4_ + fStack_bc4 + auVar16._28_4_;
          auVar104 = vandps_avx(auVar111,auVar220);
          auVar104 = vcmpps_avx(auVar104,auVar259,1);
          auVar104 = vorps_avx(auVar104,auVar166);
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar136._16_4_ = 3;
          auVar136._20_4_ = 3;
          auVar136._24_4_ = 3;
          auVar136._28_4_ = 3;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar104 = vblendvps_avx(auVar167,auVar136,auVar104);
          local_840 = ZEXT432(local_d24);
          local_8a0 = vpshufd_avx(ZEXT416(local_d24),0);
          auVar192 = vpcmpgtd_avx(auVar104._16_16_,local_8a0);
          auStack_890 = auVar27._16_16_;
          auVar207 = vpcmpgtd_avx(auVar104._0_16_,local_8a0);
          auVar137._16_16_ = auVar192;
          auVar137._0_16_ = auVar207;
          local_800 = vblendps_avx(ZEXT1632(auVar207),auVar137,0xf0);
          auVar104 = vandnps_avx(local_800,local_7e0);
          local_940._4_4_ = local_980._4_4_ + (float)local_a20._4_4_;
          local_940._0_4_ = local_980._0_4_ + (float)local_a20._0_4_;
          fStack_938 = local_980._8_4_ + fStack_a18;
          fStack_934 = local_980._12_4_ + fStack_a14;
          fStack_930 = local_980._16_4_ + fStack_a10;
          fStack_92c = local_980._20_4_ + fStack_a0c;
          fStack_928 = local_980._24_4_ + fStack_a08;
          fStack_924 = local_980._28_4_ + fStack_a04;
          while( true ) {
            local_480 = auVar104;
            local_ca0 = auVar20._0_4_;
            fStack_c9c = auVar20._4_4_;
            fStack_c98 = auVar20._8_4_;
            fStack_c94 = auVar20._12_4_;
            local_c90 = auVar19._0_4_;
            fStack_c8c = auVar19._4_4_;
            fStack_c88 = auVar19._8_4_;
            fStack_c84 = auVar19._12_4_;
            if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar104 >> 0x7f,0) == '\0') &&
                  (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar104 >> 0xbf,0) == '\0') &&
                (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar104[0x1f]) break;
            auVar138._8_4_ = 0x7f800000;
            auVar138._0_8_ = 0x7f8000007f800000;
            auVar138._12_4_ = 0x7f800000;
            auVar138._16_4_ = 0x7f800000;
            auVar138._20_4_ = 0x7f800000;
            auVar138._24_4_ = 0x7f800000;
            auVar138._28_4_ = 0x7f800000;
            auVar105 = vblendvps_avx(auVar138,local_980,auVar104);
            auVar25 = vshufps_avx(auVar105,auVar105,0xb1);
            auVar25 = vminps_avx(auVar105,auVar25);
            auVar21 = vshufpd_avx(auVar25,auVar25,5);
            auVar25 = vminps_avx(auVar25,auVar21);
            auVar21 = vperm2f128_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar25,auVar21);
            auVar105 = vcmpps_avx(auVar105,auVar25,0);
            auVar25 = auVar104 & auVar105;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar104 = vandps_avx(auVar105,auVar104);
            }
            uVar82 = vmovmskps_avx(auVar104);
            uVar91 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
              }
            }
            uVar85 = (ulong)uVar91;
            *(undefined4 *)(local_480 + uVar85 * 4) = 0;
            fVar326 = local_1a0[uVar85];
            uVar91 = *(uint *)(local_460 + uVar85 * 4);
            fVar328 = auVar121._0_4_;
            if ((float)local_a40._0_4_ < 0.0) {
              auVar293 = ZEXT1664(auVar293._0_16_);
              auVar345 = ZEXT1664(auVar345._0_16_);
              fVar328 = sqrtf((float)local_a40._0_4_);
            }
            auVar207 = vminps_avx(auVar19,_local_b40);
            auVar192 = vmaxps_avx(auVar19,_local_b40);
            auVar189 = vminps_avx(auVar20,_local_b50);
            auVar98 = vminps_avx(auVar207,auVar189);
            auVar207 = vmaxps_avx(auVar20,_local_b50);
            auVar189 = vmaxps_avx(auVar192,auVar207);
            auVar188._8_4_ = 0x7fffffff;
            auVar188._0_8_ = 0x7fffffff7fffffff;
            auVar188._12_4_ = 0x7fffffff;
            auVar192 = vandps_avx(auVar98,auVar188);
            auVar207 = vandps_avx(auVar189,auVar188);
            auVar192 = vmaxps_avx(auVar192,auVar207);
            auVar207 = vmovshdup_avx(auVar192);
            auVar207 = vmaxss_avx(auVar207,auVar192);
            auVar192 = vshufpd_avx(auVar192,auVar192,1);
            auVar192 = vmaxss_avx(auVar192,auVar207);
            local_a00 = auVar192._0_4_ * 1.9073486e-06;
            local_9e0._0_4_ = fVar328 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar189,auVar189,0xff);
            auVar192 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar326),0x10);
            auVar325 = ZEXT1664(auVar192);
            lVar89 = 5;
            do {
              do {
                auVar192 = auVar325._0_16_;
                bVar92 = lVar89 == 0;
                lVar89 = lVar89 + -1;
                if (bVar92) goto LAB_0092f4ca;
                auVar207 = vshufps_avx(auVar192,auVar192,0);
                auVar97._0_4_ = auVar207._0_4_ * (float)local_a30._0_4_ + 0.0;
                auVar97._4_4_ = auVar207._4_4_ * (float)local_a30._4_4_ + 0.0;
                auVar97._8_4_ = auVar207._8_4_ * fStack_a28 + 0.0;
                auVar97._12_4_ = auVar207._12_4_ * fStack_a24 + 0.0;
                auVar207 = vmovshdup_avx(auVar192);
                fVar174 = auVar207._0_4_;
                fVar146 = 1.0 - fVar174;
                fVar328 = fVar174 * 3.0;
                fVar326 = fVar328 + -5.0;
                fVar330 = fVar146 * fVar146;
                auVar207 = ZEXT416((uint)(fVar174 * fVar174 * -fVar146 * 0.5));
                auVar207 = vshufps_avx(auVar207,auVar207,0);
                auVar189 = ZEXT416((uint)((fVar330 * (fVar146 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar98 = ZEXT416((uint)((fVar174 * fVar174 * fVar326 + 2.0) * 0.5));
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                auVar122 = ZEXT416((uint)(fVar146 * fVar146 * -fVar174 * 0.5));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar159._0_4_ =
                     auVar122._0_4_ * local_c90 +
                     auVar98._0_4_ * (float)local_b40._0_4_ +
                     auVar189._0_4_ * local_ca0 + auVar207._0_4_ * (float)local_b50._0_4_;
                auVar159._4_4_ =
                     auVar122._4_4_ * fStack_c8c +
                     auVar98._4_4_ * (float)local_b40._4_4_ +
                     auVar189._4_4_ * fStack_c9c + auVar207._4_4_ * (float)local_b50._4_4_;
                auVar159._8_4_ =
                     auVar122._8_4_ * fStack_c88 +
                     auVar98._8_4_ * fStack_b38 +
                     auVar189._8_4_ * fStack_c98 + auVar207._8_4_ * fStack_b48;
                auVar159._12_4_ =
                     auVar122._12_4_ * fStack_c84 +
                     auVar98._12_4_ * fStack_b34 +
                     auVar189._12_4_ * fStack_c94 + auVar207._12_4_ * fStack_b44;
                _local_ae0 = auVar159;
                auVar207 = vsubps_avx(auVar97,auVar159);
                _local_ac0 = auVar207;
                auVar207 = vdpps_avx(auVar207,auVar207,0x7f);
                fVar154 = auVar207._0_4_;
                if (fVar154 < 0.0) {
                  local_a60._0_4_ = fVar174 * 9.0;
                  local_a80._0_4_ = fVar326;
                  local_aa0._0_4_ = fVar330;
                  local_8c0._0_4_ = fVar146 * -2.0;
                  fVar149 = sqrtf(fVar154);
                  fVar326 = (float)local_a80._0_4_;
                  fVar260 = (float)local_a60._0_4_;
                  fVar251 = (float)local_8c0._0_4_;
                  fVar330 = (float)local_aa0._0_4_;
                }
                else {
                  auVar189 = vsqrtss_avx(auVar207,auVar207);
                  fVar149 = auVar189._0_4_;
                  fVar260 = fVar174 * 9.0;
                  fVar251 = fVar146 * -2.0;
                }
                auVar189 = ZEXT416((uint)((fVar174 * fVar174 + fVar174 * fVar251) * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar98 = ZEXT416((uint)(((fVar146 + fVar146) * (fVar328 + 2.0) +
                                         fVar146 * fVar146 * -3.0) * 0.5));
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                auVar122 = ZEXT416((uint)((fVar326 * (fVar174 + fVar174) + fVar174 * fVar328) * 0.5)
                                  );
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar123 = ZEXT416((uint)((fVar174 * (fVar146 + fVar146) - fVar330) * 0.5));
                auVar123 = vshufps_avx(auVar123,auVar123,0);
                auVar340._0_4_ =
                     local_c90 * auVar123._0_4_ +
                     (float)local_b40._0_4_ * auVar122._0_4_ +
                     (float)local_b50._0_4_ * auVar189._0_4_ + local_ca0 * auVar98._0_4_;
                auVar340._4_4_ =
                     fStack_c8c * auVar123._4_4_ +
                     (float)local_b40._4_4_ * auVar122._4_4_ +
                     (float)local_b50._4_4_ * auVar189._4_4_ + fStack_c9c * auVar98._4_4_;
                auVar340._8_4_ =
                     fStack_c88 * auVar123._8_4_ +
                     fStack_b38 * auVar122._8_4_ +
                     fStack_b48 * auVar189._8_4_ + fStack_c98 * auVar98._8_4_;
                auVar340._12_4_ =
                     fStack_c84 * auVar123._12_4_ +
                     fStack_b34 * auVar122._12_4_ +
                     fStack_b44 * auVar189._12_4_ + fStack_c94 * auVar98._12_4_;
                auVar123 = vpermilps_avx(ZEXT416((uint)(fVar328 + -1.0)),0);
                auVar93 = vpermilps_avx(ZEXT416((uint)(fVar174 * -9.0 + 4.0)),0);
                auVar189 = vshufps_avx(ZEXT416((uint)(fVar260 + -5.0)),
                                       ZEXT416((uint)(fVar260 + -5.0)),0);
                auVar98 = ZEXT416((uint)(fVar174 * -3.0 + 2.0));
                auVar122 = vshufps_avx(auVar98,auVar98,0);
                auVar98 = vdpps_avx(auVar340,auVar340,0x7f);
                auVar124._0_4_ =
                     local_c90 * auVar122._0_4_ +
                     (float)local_b40._0_4_ * auVar189._0_4_ +
                     local_ca0 * auVar93._0_4_ + (float)local_b50._0_4_ * auVar123._0_4_;
                auVar124._4_4_ =
                     fStack_c8c * auVar122._4_4_ +
                     (float)local_b40._4_4_ * auVar189._4_4_ +
                     fStack_c9c * auVar93._4_4_ + (float)local_b50._4_4_ * auVar123._4_4_;
                auVar124._8_4_ =
                     fStack_c88 * auVar122._8_4_ +
                     fStack_b38 * auVar189._8_4_ +
                     fStack_c98 * auVar93._8_4_ + fStack_b48 * auVar123._8_4_;
                auVar124._12_4_ =
                     fStack_c84 * auVar122._12_4_ +
                     fStack_b34 * auVar189._12_4_ +
                     fStack_c94 * auVar93._12_4_ + fStack_b44 * auVar123._12_4_;
                auVar189 = vblendps_avx(auVar98,_DAT_01f45a50,0xe);
                auVar122 = vrsqrtss_avx(auVar189,auVar189);
                fVar328 = auVar122._0_4_;
                fVar326 = auVar98._0_4_;
                auVar122 = vdpps_avx(auVar340,auVar124,0x7f);
                auVar123 = vshufps_avx(auVar98,auVar98,0);
                auVar125._0_4_ = auVar124._0_4_ * auVar123._0_4_;
                auVar125._4_4_ = auVar124._4_4_ * auVar123._4_4_;
                auVar125._8_4_ = auVar124._8_4_ * auVar123._8_4_;
                auVar125._12_4_ = auVar124._12_4_ * auVar123._12_4_;
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar208._0_4_ = auVar340._0_4_ * auVar122._0_4_;
                auVar208._4_4_ = auVar340._4_4_ * auVar122._4_4_;
                auVar208._8_4_ = auVar340._8_4_ * auVar122._8_4_;
                auVar208._12_4_ = auVar340._12_4_ * auVar122._12_4_;
                auVar93 = vsubps_avx(auVar125,auVar208);
                auVar122 = vrcpss_avx(auVar189,auVar189);
                auVar189 = vmaxss_avx(ZEXT416((uint)local_a00),
                                      ZEXT416((uint)(auVar325._0_4_ * (float)local_9e0._0_4_)));
                auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar326 * auVar122._0_4_)));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                uVar85 = CONCAT44(auVar340._4_4_,auVar340._0_4_);
                auVar232._0_8_ = uVar85 ^ 0x8000000080000000;
                auVar232._8_4_ = -auVar340._8_4_;
                auVar232._12_4_ = -auVar340._12_4_;
                auVar123 = ZEXT416((uint)(fVar328 * 1.5 +
                                         fVar326 * -0.5 * fVar328 * fVar328 * fVar328));
                auVar123 = vshufps_avx(auVar123,auVar123,0);
                auVar190._0_4_ = auVar123._0_4_ * auVar93._0_4_ * auVar122._0_4_;
                auVar190._4_4_ = auVar123._4_4_ * auVar93._4_4_ * auVar122._4_4_;
                auVar190._8_4_ = auVar123._8_4_ * auVar93._8_4_ * auVar122._8_4_;
                auVar190._12_4_ = auVar123._12_4_ * auVar93._12_4_ * auVar122._12_4_;
                auVar255._0_4_ = auVar340._0_4_ * auVar123._0_4_;
                auVar255._4_4_ = auVar340._4_4_ * auVar123._4_4_;
                auVar255._8_4_ = auVar340._8_4_ * auVar123._8_4_;
                auVar255._12_4_ = auVar340._12_4_ * auVar123._12_4_;
                if (fVar326 < 0.0) {
                  fVar326 = sqrtf(fVar326);
                }
                else {
                  auVar98 = vsqrtss_avx(auVar98,auVar98);
                  fVar326 = auVar98._0_4_;
                }
                auVar98 = vdpps_avx(_local_ac0,auVar255,0x7f);
                fVar326 = (local_a00 / fVar326) * (fVar149 + 1.0) +
                          auVar189._0_4_ + fVar149 * local_a00;
                auVar122 = vdpps_avx(auVar232,auVar255,0x7f);
                auVar123 = vdpps_avx(_local_ac0,auVar190,0x7f);
                auVar93 = vdpps_avx(_local_a30,auVar255,0x7f);
                auVar94 = vdpps_avx(_local_ac0,auVar232,0x7f);
                fVar328 = auVar122._0_4_ + auVar123._0_4_;
                fVar330 = auVar98._0_4_;
                auVar99._0_4_ = fVar330 * fVar330;
                auVar99._4_4_ = auVar98._4_4_ * auVar98._4_4_;
                auVar99._8_4_ = auVar98._8_4_ * auVar98._8_4_;
                auVar99._12_4_ = auVar98._12_4_ * auVar98._12_4_;
                auVar123 = vsubps_avx(auVar207,auVar99);
                auVar122 = vdpps_avx(_local_ac0,_local_a30,0x7f);
                fVar146 = auVar94._0_4_ - fVar330 * fVar328;
                fVar174 = auVar122._0_4_ - fVar330 * auVar93._0_4_;
                auVar122 = vrsqrtss_avx(auVar123,auVar123);
                fVar149 = auVar123._0_4_;
                fVar330 = auVar122._0_4_;
                fVar330 = fVar330 * 1.5 + fVar149 * -0.5 * fVar330 * fVar330 * fVar330;
                if (fVar149 < 0.0) {
                  local_a60._0_4_ = fVar146;
                  local_a80._0_4_ = fVar174;
                  local_aa0._0_4_ = fVar330;
                  fVar149 = sqrtf(fVar149);
                  fVar330 = (float)local_aa0._0_4_;
                  fVar146 = (float)local_a60._0_4_;
                  fVar174 = (float)local_a80._0_4_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar123,auVar123);
                  fVar149 = auVar122._0_4_;
                }
                auVar345 = ZEXT1664(auVar98);
                auVar293 = ZEXT1664(auVar340);
                auVar94 = vpermilps_avx(_local_ae0,0xff);
                auVar95 = vshufps_avx(auVar340,auVar340,0xff);
                fVar146 = fVar146 * fVar330 - auVar95._0_4_;
                auVar209._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
                auVar209._8_4_ = auVar93._8_4_ ^ 0x80000000;
                auVar209._12_4_ = auVar93._12_4_ ^ 0x80000000;
                auVar233._0_4_ = -fVar146;
                auVar233._4_4_ = 0x80000000;
                auVar233._8_4_ = 0x80000000;
                auVar233._12_4_ = 0x80000000;
                auVar122 = vinsertps_avx(auVar233,ZEXT416((uint)(fVar174 * fVar330)),0x1c);
                auVar93 = vmovsldup_avx(ZEXT416((uint)(fVar328 * fVar174 * fVar330 -
                                                      auVar93._0_4_ * fVar146)));
                auVar122 = vdivps_avx(auVar122,auVar93);
                auVar123 = vinsertps_avx(ZEXT416((uint)fVar328),auVar209,0x10);
                auVar123 = vdivps_avx(auVar123,auVar93);
                auVar93 = vmovsldup_avx(auVar98);
                auVar100 = ZEXT416((uint)(fVar149 - auVar94._0_4_));
                auVar94 = vmovsldup_avx(auVar100);
                auVar160._0_4_ = auVar93._0_4_ * auVar122._0_4_ + auVar94._0_4_ * auVar123._0_4_;
                auVar160._4_4_ = auVar93._4_4_ * auVar122._4_4_ + auVar94._4_4_ * auVar123._4_4_;
                auVar160._8_4_ = auVar93._8_4_ * auVar122._8_4_ + auVar94._8_4_ * auVar123._8_4_;
                auVar160._12_4_ =
                     auVar93._12_4_ * auVar122._12_4_ + auVar94._12_4_ * auVar123._12_4_;
                auVar122 = vsubps_avx(auVar192,auVar160);
                auVar325 = ZEXT1664(auVar122);
                auVar161._8_4_ = 0x7fffffff;
                auVar161._0_8_ = 0x7fffffff7fffffff;
                auVar161._12_4_ = 0x7fffffff;
                auVar192 = vandps_avx(auVar98,auVar161);
              } while (fVar326 <= auVar192._0_4_);
              auVar191._8_4_ = 0x7fffffff;
              auVar191._0_8_ = 0x7fffffff7fffffff;
              auVar191._12_4_ = 0x7fffffff;
              auVar192 = vandps_avx(auVar100,auVar191);
            } while ((float)local_8e0._0_4_ * 1.9073486e-06 + auVar189._0_4_ + fVar326 <=
                     auVar192._0_4_);
            fVar326 = auVar122._0_4_ + (float)local_9c0._0_4_;
            if ((fVar319 <= fVar326) &&
               (fVar328 = *(float *)(ray + k * 4 + 0x100), fVar326 <= fVar328)) {
              auVar192 = vmovshdup_avx(auVar122);
              fVar330 = auVar192._0_4_;
              if ((0.0 <= fVar330) && (fVar330 <= 1.0)) {
                auVar192 = vrsqrtss_avx(auVar207,auVar207);
                fVar146 = auVar192._0_4_;
                pGVar9 = (context->scene->geometries).items[uVar87].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar192 = ZEXT416((uint)(fVar146 * 1.5 +
                                           fVar154 * -0.5 * fVar146 * fVar146 * fVar146));
                  auVar192 = vshufps_avx(auVar192,auVar192,0);
                  auVar193._0_4_ = auVar192._0_4_ * (float)local_ac0._0_4_;
                  auVar193._4_4_ = auVar192._4_4_ * (float)local_ac0._4_4_;
                  auVar193._8_4_ = auVar192._8_4_ * fStack_ab8;
                  auVar193._12_4_ = auVar192._12_4_ * fStack_ab4;
                  auVar126._0_4_ = auVar340._0_4_ + auVar95._0_4_ * auVar193._0_4_;
                  auVar126._4_4_ = auVar340._4_4_ + auVar95._4_4_ * auVar193._4_4_;
                  auVar126._8_4_ = auVar340._8_4_ + auVar95._8_4_ * auVar193._8_4_;
                  auVar126._12_4_ = auVar340._12_4_ + auVar95._12_4_ * auVar193._12_4_;
                  auVar192 = vshufps_avx(auVar193,auVar193,0xc9);
                  auVar207 = vshufps_avx(auVar340,auVar340,0xc9);
                  auVar194._0_4_ = auVar207._0_4_ * auVar193._0_4_;
                  auVar194._4_4_ = auVar207._4_4_ * auVar193._4_4_;
                  auVar194._8_4_ = auVar207._8_4_ * auVar193._8_4_;
                  auVar194._12_4_ = auVar207._12_4_ * auVar193._12_4_;
                  auVar210._0_4_ = auVar340._0_4_ * auVar192._0_4_;
                  auVar210._4_4_ = auVar340._4_4_ * auVar192._4_4_;
                  auVar210._8_4_ = auVar340._8_4_ * auVar192._8_4_;
                  auVar210._12_4_ = auVar340._12_4_ * auVar192._12_4_;
                  auVar189 = vsubps_avx(auVar210,auVar194);
                  auVar192 = vshufps_avx(auVar189,auVar189,0xc9);
                  auVar207 = vshufps_avx(auVar126,auVar126,0xc9);
                  auVar211._0_4_ = auVar207._0_4_ * auVar192._0_4_;
                  auVar211._4_4_ = auVar207._4_4_ * auVar192._4_4_;
                  auVar211._8_4_ = auVar207._8_4_ * auVar192._8_4_;
                  auVar211._12_4_ = auVar207._12_4_ * auVar192._12_4_;
                  auVar192 = vshufps_avx(auVar189,auVar189,0xd2);
                  auVar127._0_4_ = auVar126._0_4_ * auVar192._0_4_;
                  auVar127._4_4_ = auVar126._4_4_ * auVar192._4_4_;
                  auVar127._8_4_ = auVar126._8_4_ * auVar192._8_4_;
                  auVar127._12_4_ = auVar126._12_4_ * auVar192._12_4_;
                  auVar192 = vsubps_avx(auVar211,auVar127);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar326;
                    uVar90 = vextractps_avx(auVar192,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar90;
                    uVar90 = vextractps_avx(auVar192,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar90;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar192._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar330;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_9a0;
                    *(uint *)(ray + k * 4 + 0x240) = uVar87;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar13 = context->user;
                    auStack_730 = vshufps_avx(auVar122,auVar122,0x55);
                    auStack_790 = vshufps_avx(auVar192,auVar192,0x55);
                    auStack_770 = vshufps_avx(auVar192,auVar192,0xaa);
                    auStack_750 = vshufps_avx(auVar192,auVar192,0);
                    local_7a0 = (RTCHitN  [16])auStack_790;
                    local_780 = auStack_770;
                    local_760 = auStack_750;
                    local_740 = auStack_730;
                    local_720 = ZEXT832(0) << 0x20;
                    local_700 = local_640._0_8_;
                    uStack_6f8 = local_640._8_8_;
                    uStack_6f0 = local_640._16_8_;
                    uStack_6e8 = local_640._24_8_;
                    local_6e0 = local_620;
                    auVar104 = vcmpps_avx(local_620,local_620,0xf);
                    local_ae8[1] = auVar104;
                    *local_ae8 = auVar104;
                    local_6c0 = pRVar13->instID[0];
                    uStack_6bc = local_6c0;
                    uStack_6b8 = local_6c0;
                    uStack_6b4 = local_6c0;
                    uStack_6b0 = local_6c0;
                    uStack_6ac = local_6c0;
                    uStack_6a8 = local_6c0;
                    uStack_6a4 = local_6c0;
                    local_6a0 = pRVar13->instPrimID[0];
                    uStack_69c = local_6a0;
                    uStack_698 = local_6a0;
                    uStack_694 = local_6a0;
                    uStack_690 = local_6a0;
                    uStack_68c = local_6a0;
                    uStack_688 = local_6a0;
                    uStack_684 = local_6a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar326;
                    local_b80 = *local_af0;
                    local_b70 = *local_af8;
                    local_b28.valid = (int *)local_b80;
                    local_b28.geometryUserPtr = pGVar9->userPtr;
                    local_b28.context = context->user;
                    local_b28.hit = local_7a0;
                    local_b28.N = 8;
                    local_b28.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar293 = ZEXT1664(auVar340);
                      auVar345 = ZEXT1664(auVar98);
                      (*pGVar9->intersectionFilterN)(&local_b28);
                    }
                    auVar192 = vpcmpeqd_avx(local_b80,ZEXT816(0) << 0x40);
                    auVar207 = vpcmpeqd_avx(local_b70,ZEXT816(0) << 0x40);
                    auVar168._16_16_ = auVar207;
                    auVar168._0_16_ = auVar192;
                    auVar104 = _DAT_01f7b020 & ~auVar168;
                    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar104 >> 0x7f,0) != '\0') ||
                          (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar104 >> 0xbf,0) != '\0') ||
                        (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar104[0x1f] < '\0') {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar293 = ZEXT1664(auVar293._0_16_);
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        (*p_Var14)(&local_b28);
                      }
                      auVar192 = vpcmpeqd_avx(local_b80,ZEXT816(0) << 0x40);
                      auVar207 = vpcmpeqd_avx(local_b70,ZEXT816(0) << 0x40);
                      auVar112._16_16_ = auVar207;
                      auVar112._0_16_ = auVar192;
                      auVar104 = _DAT_01f7b020 & ~auVar112;
                      if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar104 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar104 >> 0x7f,0) != '\0') ||
                            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar104 >> 0xbf,0) != '\0') ||
                          (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar104[0x1f] < '\0') {
                        auVar113._0_8_ = auVar192._0_8_ ^ 0xffffffffffffffff;
                        auVar113._8_4_ = auVar192._8_4_ ^ 0xffffffff;
                        auVar113._12_4_ = auVar192._12_4_ ^ 0xffffffff;
                        auVar113._16_4_ = auVar207._0_4_ ^ 0xffffffff;
                        auVar113._20_4_ = auVar207._4_4_ ^ 0xffffffff;
                        auVar113._24_4_ = auVar207._8_4_ ^ 0xffffffff;
                        auVar113._28_4_ = auVar207._12_4_ ^ 0xffffffff;
                        auVar104 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])local_b28.hit);
                        *(undefined1 (*) [32])(local_b28.ray + 0x180) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x20));
                        *(undefined1 (*) [32])(local_b28.ray + 0x1a0) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x40));
                        *(undefined1 (*) [32])(local_b28.ray + 0x1c0) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x60));
                        *(undefined1 (*) [32])(local_b28.ray + 0x1e0) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x80));
                        *(undefined1 (*) [32])(local_b28.ray + 0x200) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b28.ray + 0x220) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b28.ray + 0x240) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b28.ray + 0x260) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar113,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x100));
                        *(undefined1 (*) [32])(local_b28.ray + 0x280) = auVar104;
                        goto LAB_0092f4ca;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar328;
                  }
                }
              }
            }
LAB_0092f4ca:
            uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar107._4_4_ = uVar90;
            auVar107._0_4_ = uVar90;
            auVar107._8_4_ = uVar90;
            auVar107._12_4_ = uVar90;
            auVar107._16_4_ = uVar90;
            auVar107._20_4_ = uVar90;
            auVar107._24_4_ = uVar90;
            auVar107._28_4_ = uVar90;
            auVar104 = vcmpps_avx(_local_940,auVar107,2);
            auVar104 = vandps_avx(auVar104,local_480);
          }
          auVar114._0_4_ = (float)local_a20._0_4_ + (float)local_900._0_4_;
          auVar114._4_4_ = (float)local_a20._4_4_ + (float)local_900._4_4_;
          auVar114._8_4_ = fStack_a18 + fStack_8f8;
          auVar114._12_4_ = fStack_a14 + fStack_8f4;
          auVar114._16_4_ = fStack_a10 + fStack_8f0;
          auVar114._20_4_ = fStack_a0c + fStack_8ec;
          auVar114._24_4_ = fStack_a08 + fStack_8e8;
          auVar114._28_4_ = fStack_a04 + fStack_8e4;
          auVar192 = vpshufd_avx(auVar107._0_16_,0);
          auVar139._16_16_ = auVar192;
          auVar139._0_16_ = auVar192;
          auVar104 = vcmpps_avx(auVar114,auVar139,2);
          local_920 = vandps_avx(auVar104,local_920);
          auVar115._8_4_ = 3;
          auVar115._0_8_ = 0x300000003;
          auVar115._12_4_ = 3;
          auVar115._16_4_ = 3;
          auVar115._20_4_ = 3;
          auVar115._24_4_ = 3;
          auVar115._28_4_ = 3;
          auVar140._8_4_ = 2;
          auVar140._0_8_ = 0x200000002;
          auVar140._12_4_ = 2;
          auVar140._16_4_ = 2;
          auVar140._20_4_ = 2;
          auVar140._24_4_ = 2;
          auVar140._28_4_ = 2;
          auVar104 = vblendvps_avx(auVar140,auVar115,local_820);
          auVar192 = vpcmpgtd_avx(auVar104._16_16_,local_8a0);
          auVar207 = vpshufd_avx(local_840._0_16_,0);
          auVar207 = vpcmpgtd_avx(auVar104._0_16_,auVar207);
          auVar141._16_16_ = auVar192;
          auVar141._0_16_ = auVar207;
          _local_940 = vblendps_avx(ZEXT1632(auVar207),auVar141,0xf0);
          auVar104 = vandnps_avx(_local_940,local_920);
          local_980 = _local_420;
          local_900._4_4_ = (float)local_a20._4_4_ + (float)local_420._4_4_;
          local_900._0_4_ = (float)local_a20._0_4_ + (float)local_420._0_4_;
          fStack_8f8 = fStack_a18 + fStack_418;
          fStack_8f4 = fStack_a14 + fStack_414;
          fStack_8f0 = fStack_a10 + fStack_410;
          fStack_8ec = fStack_a0c + fStack_40c;
          fStack_8e8 = fStack_a08 + fStack_408;
          fStack_8e4 = fStack_a04 + fStack_404;
          while( true ) {
            local_4a0 = auVar104;
            if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar104 >> 0x7f,0) == '\0') &&
                  (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar104 >> 0xbf,0) == '\0') &&
                (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar104[0x1f]) break;
            auVar142._8_4_ = 0x7f800000;
            auVar142._0_8_ = 0x7f8000007f800000;
            auVar142._12_4_ = 0x7f800000;
            auVar142._16_4_ = 0x7f800000;
            auVar142._20_4_ = 0x7f800000;
            auVar142._24_4_ = 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar105 = vblendvps_avx(auVar142,local_980,auVar104);
            auVar25 = vshufps_avx(auVar105,auVar105,0xb1);
            auVar25 = vminps_avx(auVar105,auVar25);
            auVar21 = vshufpd_avx(auVar25,auVar25,5);
            auVar25 = vminps_avx(auVar25,auVar21);
            auVar21 = vperm2f128_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar25,auVar21);
            auVar105 = vcmpps_avx(auVar105,auVar25,0);
            auVar25 = auVar104 & auVar105;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar104 = vandps_avx(auVar105,auVar104);
            }
            uVar82 = vmovmskps_avx(auVar104);
            uVar91 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
              }
            }
            uVar85 = (ulong)uVar91;
            *(undefined4 *)(local_4a0 + uVar85 * 4) = 0;
            fVar326 = local_1c0[uVar85];
            uVar91 = *(uint *)(local_400 + uVar85 * 4);
            fVar328 = auVar17._0_4_;
            if ((float)local_a40._0_4_ < 0.0) {
              auVar293 = ZEXT1664(auVar293._0_16_);
              fVar328 = sqrtf((float)local_a40._0_4_);
            }
            auVar207 = vminps_avx(auVar19,_local_b40);
            auVar192 = vmaxps_avx(auVar19,_local_b40);
            auVar189 = vminps_avx(auVar20,_local_b50);
            auVar98 = vminps_avx(auVar207,auVar189);
            auVar207 = vmaxps_avx(auVar20,_local_b50);
            auVar189 = vmaxps_avx(auVar192,auVar207);
            auVar195._8_4_ = 0x7fffffff;
            auVar195._0_8_ = 0x7fffffff7fffffff;
            auVar195._12_4_ = 0x7fffffff;
            auVar192 = vandps_avx(auVar98,auVar195);
            auVar207 = vandps_avx(auVar189,auVar195);
            auVar192 = vmaxps_avx(auVar192,auVar207);
            auVar207 = vmovshdup_avx(auVar192);
            auVar207 = vmaxss_avx(auVar207,auVar192);
            auVar192 = vshufpd_avx(auVar192,auVar192,1);
            auVar192 = vmaxss_avx(auVar192,auVar207);
            local_a00 = auVar192._0_4_ * 1.9073486e-06;
            local_9e0._0_4_ = fVar328 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar189,auVar189,0xff);
            auVar192 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar326),0x10);
            auVar345 = ZEXT1664(auVar192);
            lVar89 = 5;
            do {
              do {
                auVar192 = auVar345._0_16_;
                bVar92 = lVar89 == 0;
                lVar89 = lVar89 + -1;
                if (bVar92) goto LAB_0093019e;
                auVar207 = vshufps_avx(auVar192,auVar192,0);
                auVar101._0_4_ = auVar207._0_4_ * (float)local_a30._0_4_ + 0.0;
                auVar101._4_4_ = auVar207._4_4_ * (float)local_a30._4_4_ + 0.0;
                auVar101._8_4_ = auVar207._8_4_ * fStack_a28 + 0.0;
                auVar101._12_4_ = auVar207._12_4_ * fStack_a24 + 0.0;
                auVar207 = vmovshdup_avx(auVar192);
                fVar174 = auVar207._0_4_;
                fVar146 = 1.0 - fVar174;
                fVar328 = fVar174 * 3.0;
                fVar326 = fVar328 + -5.0;
                fVar330 = fVar146 * fVar146;
                auVar207 = ZEXT416((uint)(fVar174 * fVar174 * -fVar146 * 0.5));
                auVar207 = vshufps_avx(auVar207,auVar207,0);
                auVar189 = ZEXT416((uint)((fVar330 * (fVar146 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar98 = ZEXT416((uint)((fVar174 * fVar174 * fVar326 + 2.0) * 0.5));
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                auVar122 = ZEXT416((uint)(fVar146 * fVar146 * -fVar174 * 0.5));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar162._0_4_ =
                     auVar122._0_4_ * local_c90 +
                     auVar98._0_4_ * (float)local_b40._0_4_ +
                     auVar189._0_4_ * local_ca0 + auVar207._0_4_ * (float)local_b50._0_4_;
                auVar162._4_4_ =
                     auVar122._4_4_ * fStack_c8c +
                     auVar98._4_4_ * (float)local_b40._4_4_ +
                     auVar189._4_4_ * fStack_c9c + auVar207._4_4_ * (float)local_b50._4_4_;
                auVar162._8_4_ =
                     auVar122._8_4_ * fStack_c88 +
                     auVar98._8_4_ * fStack_b38 +
                     auVar189._8_4_ * fStack_c98 + auVar207._8_4_ * fStack_b48;
                auVar162._12_4_ =
                     auVar122._12_4_ * fStack_c84 +
                     auVar98._12_4_ * fStack_b34 +
                     auVar189._12_4_ * fStack_c94 + auVar207._12_4_ * fStack_b44;
                _local_ae0 = auVar162;
                auVar207 = vsubps_avx(auVar101,auVar162);
                _local_ac0 = auVar207;
                auVar207 = vdpps_avx(auVar207,auVar207,0x7f);
                fVar154 = auVar207._0_4_;
                if (fVar154 < 0.0) {
                  local_a60._0_4_ = fVar174 * 9.0;
                  local_a80._0_4_ = fVar326;
                  local_aa0._0_4_ = fVar330;
                  local_8c0._0_4_ = fVar146 * -2.0;
                  fVar149 = sqrtf(fVar154);
                  fVar326 = (float)local_a80._0_4_;
                  fVar260 = (float)local_a60._0_4_;
                  fVar251 = (float)local_8c0._0_4_;
                  fVar330 = (float)local_aa0._0_4_;
                }
                else {
                  auVar189 = vsqrtss_avx(auVar207,auVar207);
                  fVar149 = auVar189._0_4_;
                  fVar260 = fVar174 * 9.0;
                  fVar251 = fVar146 * -2.0;
                }
                auVar189 = ZEXT416((uint)((fVar174 * fVar174 + fVar174 * fVar251) * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar98 = ZEXT416((uint)(((fVar146 + fVar146) * (fVar328 + 2.0) +
                                         fVar146 * fVar146 * -3.0) * 0.5));
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                auVar122 = ZEXT416((uint)((fVar326 * (fVar174 + fVar174) + fVar174 * fVar328) * 0.5)
                                  );
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar123 = ZEXT416((uint)((fVar174 * (fVar146 + fVar146) - fVar330) * 0.5));
                auVar123 = vshufps_avx(auVar123,auVar123,0);
                auVar324._0_4_ =
                     local_c90 * auVar123._0_4_ +
                     (float)local_b40._0_4_ * auVar122._0_4_ +
                     (float)local_b50._0_4_ * auVar189._0_4_ + local_ca0 * auVar98._0_4_;
                auVar324._4_4_ =
                     fStack_c8c * auVar123._4_4_ +
                     (float)local_b40._4_4_ * auVar122._4_4_ +
                     (float)local_b50._4_4_ * auVar189._4_4_ + fStack_c9c * auVar98._4_4_;
                auVar324._8_4_ =
                     fStack_c88 * auVar123._8_4_ +
                     fStack_b38 * auVar122._8_4_ +
                     fStack_b48 * auVar189._8_4_ + fStack_c98 * auVar98._8_4_;
                auVar324._12_4_ =
                     fStack_c84 * auVar123._12_4_ +
                     fStack_b34 * auVar122._12_4_ +
                     fStack_b44 * auVar189._12_4_ + fStack_c94 * auVar98._12_4_;
                auVar123 = vpermilps_avx(ZEXT416((uint)(fVar328 + -1.0)),0);
                auVar93 = vpermilps_avx(ZEXT416((uint)(fVar174 * -9.0 + 4.0)),0);
                auVar189 = vshufps_avx(ZEXT416((uint)(fVar260 + -5.0)),
                                       ZEXT416((uint)(fVar260 + -5.0)),0);
                auVar98 = ZEXT416((uint)(fVar174 * -3.0 + 2.0));
                auVar122 = vshufps_avx(auVar98,auVar98,0);
                auVar98 = vdpps_avx(auVar324,auVar324,0x7f);
                auVar128._0_4_ =
                     local_c90 * auVar122._0_4_ +
                     (float)local_b40._0_4_ * auVar189._0_4_ +
                     local_ca0 * auVar93._0_4_ + (float)local_b50._0_4_ * auVar123._0_4_;
                auVar128._4_4_ =
                     fStack_c8c * auVar122._4_4_ +
                     (float)local_b40._4_4_ * auVar189._4_4_ +
                     fStack_c9c * auVar93._4_4_ + (float)local_b50._4_4_ * auVar123._4_4_;
                auVar128._8_4_ =
                     fStack_c88 * auVar122._8_4_ +
                     fStack_b38 * auVar189._8_4_ +
                     fStack_c98 * auVar93._8_4_ + fStack_b48 * auVar123._8_4_;
                auVar128._12_4_ =
                     fStack_c84 * auVar122._12_4_ +
                     fStack_b34 * auVar189._12_4_ +
                     fStack_c94 * auVar93._12_4_ + fStack_b44 * auVar123._12_4_;
                auVar189 = vblendps_avx(auVar98,_DAT_01f45a50,0xe);
                auVar122 = vrsqrtss_avx(auVar189,auVar189);
                fVar328 = auVar122._0_4_;
                fVar326 = auVar98._0_4_;
                auVar122 = vdpps_avx(auVar324,auVar128,0x7f);
                auVar123 = vshufps_avx(auVar98,auVar98,0);
                auVar129._0_4_ = auVar128._0_4_ * auVar123._0_4_;
                auVar129._4_4_ = auVar128._4_4_ * auVar123._4_4_;
                auVar129._8_4_ = auVar128._8_4_ * auVar123._8_4_;
                auVar129._12_4_ = auVar128._12_4_ * auVar123._12_4_;
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar212._0_4_ = auVar324._0_4_ * auVar122._0_4_;
                auVar212._4_4_ = auVar324._4_4_ * auVar122._4_4_;
                auVar212._8_4_ = auVar324._8_4_ * auVar122._8_4_;
                auVar212._12_4_ = auVar324._12_4_ * auVar122._12_4_;
                auVar93 = vsubps_avx(auVar129,auVar212);
                auVar122 = vrcpss_avx(auVar189,auVar189);
                auVar189 = vmaxss_avx(ZEXT416((uint)local_a00),
                                      ZEXT416((uint)(auVar345._0_4_ * (float)local_9e0._0_4_)));
                auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar326 * auVar122._0_4_)));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                uVar85 = CONCAT44(auVar324._4_4_,auVar324._0_4_);
                auVar234._0_8_ = uVar85 ^ 0x8000000080000000;
                auVar234._8_4_ = -auVar324._8_4_;
                auVar234._12_4_ = -auVar324._12_4_;
                auVar123 = ZEXT416((uint)(fVar328 * 1.5 +
                                         fVar326 * -0.5 * fVar328 * fVar328 * fVar328));
                auVar123 = vshufps_avx(auVar123,auVar123,0);
                auVar196._0_4_ = auVar123._0_4_ * auVar93._0_4_ * auVar122._0_4_;
                auVar196._4_4_ = auVar123._4_4_ * auVar93._4_4_ * auVar122._4_4_;
                auVar196._8_4_ = auVar123._8_4_ * auVar93._8_4_ * auVar122._8_4_;
                auVar196._12_4_ = auVar123._12_4_ * auVar93._12_4_ * auVar122._12_4_;
                auVar256._0_4_ = auVar324._0_4_ * auVar123._0_4_;
                auVar256._4_4_ = auVar324._4_4_ * auVar123._4_4_;
                auVar256._8_4_ = auVar324._8_4_ * auVar123._8_4_;
                auVar256._12_4_ = auVar324._12_4_ * auVar123._12_4_;
                if (fVar326 < 0.0) {
                  fVar326 = sqrtf(fVar326);
                }
                else {
                  auVar98 = vsqrtss_avx(auVar98,auVar98);
                  fVar326 = auVar98._0_4_;
                }
                auVar98 = vdpps_avx(_local_ac0,auVar256,0x7f);
                fVar326 = (local_a00 / fVar326) * (fVar149 + 1.0) +
                          auVar189._0_4_ + fVar149 * local_a00;
                auVar122 = vdpps_avx(auVar234,auVar256,0x7f);
                auVar123 = vdpps_avx(_local_ac0,auVar196,0x7f);
                auVar93 = vdpps_avx(_local_a30,auVar256,0x7f);
                auVar94 = vdpps_avx(_local_ac0,auVar234,0x7f);
                fVar328 = auVar122._0_4_ + auVar123._0_4_;
                fVar330 = auVar98._0_4_;
                auVar102._0_4_ = fVar330 * fVar330;
                auVar102._4_4_ = auVar98._4_4_ * auVar98._4_4_;
                auVar102._8_4_ = auVar98._8_4_ * auVar98._8_4_;
                auVar102._12_4_ = auVar98._12_4_ * auVar98._12_4_;
                auVar123 = vsubps_avx(auVar207,auVar102);
                auVar122 = vdpps_avx(_local_ac0,_local_a30,0x7f);
                fVar146 = auVar94._0_4_ - fVar330 * fVar328;
                fVar174 = auVar122._0_4_ - fVar330 * auVar93._0_4_;
                auVar122 = vrsqrtss_avx(auVar123,auVar123);
                fVar149 = auVar123._0_4_;
                fVar330 = auVar122._0_4_;
                fVar330 = fVar330 * 1.5 + fVar149 * -0.5 * fVar330 * fVar330 * fVar330;
                if (fVar149 < 0.0) {
                  local_a60._0_4_ = fVar146;
                  local_a80._0_4_ = fVar174;
                  local_aa0._0_4_ = fVar330;
                  fVar149 = sqrtf(fVar149);
                  fVar330 = (float)local_aa0._0_4_;
                  fVar146 = (float)local_a60._0_4_;
                  fVar174 = (float)local_a80._0_4_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar123,auVar123);
                  fVar149 = auVar122._0_4_;
                }
                auVar293 = ZEXT1664(auVar324);
                auVar94 = vpermilps_avx(_local_ae0,0xff);
                auVar95 = vshufps_avx(auVar324,auVar324,0xff);
                fVar146 = fVar146 * fVar330 - auVar95._0_4_;
                auVar213._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
                auVar213._8_4_ = auVar93._8_4_ ^ 0x80000000;
                auVar213._12_4_ = auVar93._12_4_ ^ 0x80000000;
                auVar235._0_4_ = -fVar146;
                auVar235._4_4_ = 0x80000000;
                auVar235._8_4_ = 0x80000000;
                auVar235._12_4_ = 0x80000000;
                auVar122 = vinsertps_avx(auVar235,ZEXT416((uint)(fVar174 * fVar330)),0x1c);
                auVar93 = vmovsldup_avx(ZEXT416((uint)(fVar328 * fVar174 * fVar330 -
                                                      auVar93._0_4_ * fVar146)));
                auVar122 = vdivps_avx(auVar122,auVar93);
                auVar123 = vinsertps_avx(ZEXT416((uint)fVar328),auVar213,0x10);
                auVar123 = vdivps_avx(auVar123,auVar93);
                auVar93 = vmovsldup_avx(auVar98);
                auVar100 = ZEXT416((uint)(fVar149 - auVar94._0_4_));
                auVar94 = vmovsldup_avx(auVar100);
                auVar163._0_4_ = auVar93._0_4_ * auVar122._0_4_ + auVar94._0_4_ * auVar123._0_4_;
                auVar163._4_4_ = auVar93._4_4_ * auVar122._4_4_ + auVar94._4_4_ * auVar123._4_4_;
                auVar163._8_4_ = auVar93._8_4_ * auVar122._8_4_ + auVar94._8_4_ * auVar123._8_4_;
                auVar163._12_4_ =
                     auVar93._12_4_ * auVar122._12_4_ + auVar94._12_4_ * auVar123._12_4_;
                auVar122 = vsubps_avx(auVar192,auVar163);
                auVar345 = ZEXT1664(auVar122);
                auVar164._8_4_ = 0x7fffffff;
                auVar164._0_8_ = 0x7fffffff7fffffff;
                auVar164._12_4_ = 0x7fffffff;
                auVar192 = vandps_avx(auVar98,auVar164);
              } while (fVar326 <= auVar192._0_4_);
              auVar197._8_4_ = 0x7fffffff;
              auVar197._0_8_ = 0x7fffffff7fffffff;
              auVar197._12_4_ = 0x7fffffff;
              auVar192 = vandps_avx(auVar100,auVar197);
            } while ((float)local_8e0._0_4_ * 1.9073486e-06 + auVar189._0_4_ + fVar326 <=
                     auVar192._0_4_);
            fVar326 = auVar122._0_4_ + (float)local_9c0._0_4_;
            if ((fVar319 <= fVar326) &&
               (fVar328 = *(float *)(ray + k * 4 + 0x100), fVar326 <= fVar328)) {
              auVar192 = vmovshdup_avx(auVar122);
              fVar330 = auVar192._0_4_;
              if ((0.0 <= fVar330) && (fVar330 <= 1.0)) {
                auVar192 = vrsqrtss_avx(auVar207,auVar207);
                fVar146 = auVar192._0_4_;
                pGVar9 = (context->scene->geometries).items[uVar87].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar192 = ZEXT416((uint)(fVar146 * 1.5 +
                                           fVar154 * -0.5 * fVar146 * fVar146 * fVar146));
                  auVar192 = vshufps_avx(auVar192,auVar192,0);
                  auVar198._0_4_ = auVar192._0_4_ * (float)local_ac0._0_4_;
                  auVar198._4_4_ = auVar192._4_4_ * (float)local_ac0._4_4_;
                  auVar198._8_4_ = auVar192._8_4_ * fStack_ab8;
                  auVar198._12_4_ = auVar192._12_4_ * fStack_ab4;
                  auVar130._0_4_ = auVar324._0_4_ + auVar95._0_4_ * auVar198._0_4_;
                  auVar130._4_4_ = auVar324._4_4_ + auVar95._4_4_ * auVar198._4_4_;
                  auVar130._8_4_ = auVar324._8_4_ + auVar95._8_4_ * auVar198._8_4_;
                  auVar130._12_4_ = auVar324._12_4_ + auVar95._12_4_ * auVar198._12_4_;
                  auVar192 = vshufps_avx(auVar198,auVar198,0xc9);
                  auVar207 = vshufps_avx(auVar324,auVar324,0xc9);
                  auVar199._0_4_ = auVar207._0_4_ * auVar198._0_4_;
                  auVar199._4_4_ = auVar207._4_4_ * auVar198._4_4_;
                  auVar199._8_4_ = auVar207._8_4_ * auVar198._8_4_;
                  auVar199._12_4_ = auVar207._12_4_ * auVar198._12_4_;
                  auVar214._0_4_ = auVar324._0_4_ * auVar192._0_4_;
                  auVar214._4_4_ = auVar324._4_4_ * auVar192._4_4_;
                  auVar214._8_4_ = auVar324._8_4_ * auVar192._8_4_;
                  auVar214._12_4_ = auVar324._12_4_ * auVar192._12_4_;
                  auVar189 = vsubps_avx(auVar214,auVar199);
                  auVar192 = vshufps_avx(auVar189,auVar189,0xc9);
                  auVar207 = vshufps_avx(auVar130,auVar130,0xc9);
                  auVar215._0_4_ = auVar207._0_4_ * auVar192._0_4_;
                  auVar215._4_4_ = auVar207._4_4_ * auVar192._4_4_;
                  auVar215._8_4_ = auVar207._8_4_ * auVar192._8_4_;
                  auVar215._12_4_ = auVar207._12_4_ * auVar192._12_4_;
                  auVar192 = vshufps_avx(auVar189,auVar189,0xd2);
                  auVar131._0_4_ = auVar130._0_4_ * auVar192._0_4_;
                  auVar131._4_4_ = auVar130._4_4_ * auVar192._4_4_;
                  auVar131._8_4_ = auVar130._8_4_ * auVar192._8_4_;
                  auVar131._12_4_ = auVar130._12_4_ * auVar192._12_4_;
                  auVar192 = vsubps_avx(auVar215,auVar131);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar326;
                    uVar90 = vextractps_avx(auVar192,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar90;
                    uVar90 = vextractps_avx(auVar192,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar90;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar192._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar330;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_9a0;
                    *(uint *)(ray + k * 4 + 0x240) = uVar87;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar13 = context->user;
                    auStack_730 = vshufps_avx(auVar122,auVar122,0x55);
                    auStack_790 = vshufps_avx(auVar192,auVar192,0x55);
                    auStack_770 = vshufps_avx(auVar192,auVar192,0xaa);
                    auStack_750 = vshufps_avx(auVar192,auVar192,0);
                    local_7a0 = (RTCHitN  [16])auStack_790;
                    local_780 = auStack_770;
                    local_760 = auStack_750;
                    local_740 = auStack_730;
                    local_720 = ZEXT832(0) << 0x20;
                    local_700 = local_640._0_8_;
                    uStack_6f8 = local_640._8_8_;
                    uStack_6f0 = local_640._16_8_;
                    uStack_6e8 = local_640._24_8_;
                    local_6e0 = local_620;
                    auVar104 = vcmpps_avx(local_620,local_620,0xf);
                    local_ae8[1] = auVar104;
                    *local_ae8 = auVar104;
                    local_6c0 = pRVar13->instID[0];
                    uStack_6bc = local_6c0;
                    uStack_6b8 = local_6c0;
                    uStack_6b4 = local_6c0;
                    uStack_6b0 = local_6c0;
                    uStack_6ac = local_6c0;
                    uStack_6a8 = local_6c0;
                    uStack_6a4 = local_6c0;
                    local_6a0 = pRVar13->instPrimID[0];
                    uStack_69c = local_6a0;
                    uStack_698 = local_6a0;
                    uStack_694 = local_6a0;
                    uStack_690 = local_6a0;
                    uStack_68c = local_6a0;
                    uStack_688 = local_6a0;
                    uStack_684 = local_6a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar326;
                    local_b80 = *local_af0;
                    local_b70 = *local_af8;
                    local_b28.valid = (int *)local_b80;
                    local_b28.geometryUserPtr = pGVar9->userPtr;
                    local_b28.context = context->user;
                    local_b28.hit = local_7a0;
                    local_b28.N = 8;
                    local_b28.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar293 = ZEXT1664(auVar324);
                      auVar345 = ZEXT1664(auVar122);
                      (*pGVar9->intersectionFilterN)(&local_b28);
                    }
                    auVar192 = vpcmpeqd_avx(local_b80,ZEXT816(0) << 0x40);
                    auVar207 = vpcmpeqd_avx(local_b70,ZEXT816(0) << 0x40);
                    auVar169._16_16_ = auVar207;
                    auVar169._0_16_ = auVar192;
                    auVar104 = _DAT_01f7b020 & ~auVar169;
                    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar104 >> 0x7f,0) != '\0') ||
                          (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar104 >> 0xbf,0) != '\0') ||
                        (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar104[0x1f] < '\0') {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar293 = ZEXT1664(auVar293._0_16_);
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        (*p_Var14)(&local_b28);
                      }
                      auVar192 = vpcmpeqd_avx(local_b80,ZEXT816(0) << 0x40);
                      auVar207 = vpcmpeqd_avx(local_b70,ZEXT816(0) << 0x40);
                      auVar116._16_16_ = auVar207;
                      auVar116._0_16_ = auVar192;
                      auVar104 = _DAT_01f7b020 & ~auVar116;
                      if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar104 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar104 >> 0x7f,0) != '\0') ||
                            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar104 >> 0xbf,0) != '\0') ||
                          (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar104[0x1f] < '\0') {
                        auVar117._0_8_ = auVar192._0_8_ ^ 0xffffffffffffffff;
                        auVar117._8_4_ = auVar192._8_4_ ^ 0xffffffff;
                        auVar117._12_4_ = auVar192._12_4_ ^ 0xffffffff;
                        auVar117._16_4_ = auVar207._0_4_ ^ 0xffffffff;
                        auVar117._20_4_ = auVar207._4_4_ ^ 0xffffffff;
                        auVar117._24_4_ = auVar207._8_4_ ^ 0xffffffff;
                        auVar117._28_4_ = auVar207._12_4_ ^ 0xffffffff;
                        auVar104 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])local_b28.hit);
                        *(undefined1 (*) [32])(local_b28.ray + 0x180) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x20));
                        *(undefined1 (*) [32])(local_b28.ray + 0x1a0) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x40));
                        *(undefined1 (*) [32])(local_b28.ray + 0x1c0) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x60));
                        *(undefined1 (*) [32])(local_b28.ray + 0x1e0) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x80));
                        *(undefined1 (*) [32])(local_b28.ray + 0x200) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b28.ray + 0x220) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b28.ray + 0x240) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b28.ray + 0x260) = auVar104;
                        auVar104 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_b28.hit + 0x100));
                        *(undefined1 (*) [32])(local_b28.ray + 0x280) = auVar104;
                        goto LAB_0093019e;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar328;
                  }
                }
              }
            }
LAB_0093019e:
            uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar107._4_4_ = uVar90;
            auVar107._0_4_ = uVar90;
            auVar107._8_4_ = uVar90;
            auVar107._12_4_ = uVar90;
            auVar107._16_4_ = uVar90;
            auVar107._20_4_ = uVar90;
            auVar107._24_4_ = uVar90;
            auVar107._28_4_ = uVar90;
            auVar104 = vcmpps_avx(_local_900,auVar107,2);
            auVar104 = vandps_avx(auVar104,local_4a0);
          }
          auVar104 = vandps_avx(local_800,local_7e0);
          auVar105 = vandps_avx(_local_940,local_920);
          auVar170._0_4_ = (float)local_a20._0_4_ + local_460._0_4_;
          auVar170._4_4_ = (float)local_a20._4_4_ + local_460._4_4_;
          auVar170._8_4_ = fStack_a18 + local_460._8_4_;
          auVar170._12_4_ = fStack_a14 + local_460._12_4_;
          auVar170._16_4_ = fStack_a10 + local_460._16_4_;
          auVar170._20_4_ = fStack_a0c + local_460._20_4_;
          auVar170._24_4_ = fStack_a08 + local_460._24_4_;
          auVar170._28_4_ = fStack_a04 + local_460._28_4_;
          auVar192 = vpshufd_avx(auVar107._0_16_,0);
          auVar221._16_16_ = auVar192;
          auVar221._0_16_ = auVar192;
          auVar25 = vcmpps_avx(auVar170,auVar221,2);
          auVar104 = vandps_avx(auVar25,auVar104);
          auVar243._0_4_ = (float)local_a20._0_4_ + local_420._0_4_;
          auVar243._4_4_ = (float)local_a20._4_4_ + local_420._4_4_;
          auVar243._8_4_ = fStack_a18 + local_420._8_4_;
          auVar243._12_4_ = fStack_a14 + local_420._12_4_;
          auVar243._16_4_ = fStack_a10 + local_420._16_4_;
          auVar243._20_4_ = fStack_a0c + local_420._20_4_;
          auVar243._24_4_ = fStack_a08 + local_420._24_4_;
          auVar243._28_4_ = fStack_a04 + local_420._28_4_;
          auVar25 = vcmpps_avx(auVar243,auVar221,2);
          auVar105 = vandps_avx(auVar25,auVar105);
          auVar105 = vorps_avx(auVar104,auVar105);
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar105 >> 0x7f,0) != '\0') ||
                (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0xbf,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar105[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar84 * 0x60) = auVar105;
            auVar104 = vblendvps_avx(_local_420,_local_460,auVar104);
            *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x60) = auVar104;
            uVar85 = vmovlps_avx(local_7b0);
            (&uStack_140)[uVar84 * 0xc] = uVar85;
            auStack_138[uVar84 * 0x18] = local_d24 + 1;
            uVar84 = (ulong)((int)uVar84 + 1);
          }
          fVar119 = (float)local_a20._0_4_;
          fVar144 = (float)local_a20._4_4_;
          fVar145 = fStack_a18;
          fVar148 = fStack_a14;
          fVar150 = fStack_a10;
          fVar151 = fStack_a0c;
          fVar152 = fStack_a08;
          fVar252 = fStack_a04;
        }
      }
    }
    while( true ) {
      uVar91 = (uint)uVar84;
      if (uVar91 == 0) {
        uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar103._4_4_ = uVar90;
        auVar103._0_4_ = uVar90;
        auVar103._8_4_ = uVar90;
        auVar103._12_4_ = uVar90;
        auVar121 = vcmpps_avx(local_7c0,auVar103,2);
        uVar87 = vmovmskps_avx(auVar121);
        uVar83 = (ulong)((uint)uVar83 - 1 & (uint)uVar83 & uVar87);
        goto LAB_0092d820;
      }
      uVar84 = (ulong)(uVar91 - 1);
      lVar89 = uVar84 * 0x60;
      auVar104 = *(undefined1 (*) [32])(auStack_160 + lVar89);
      auVar118._0_4_ = fVar119 + auVar104._0_4_;
      auVar118._4_4_ = fVar144 + auVar104._4_4_;
      auVar118._8_4_ = fVar145 + auVar104._8_4_;
      auVar118._12_4_ = fVar148 + auVar104._12_4_;
      auVar118._16_4_ = fVar150 + auVar104._16_4_;
      auVar118._20_4_ = fVar151 + auVar104._20_4_;
      auVar118._24_4_ = fVar152 + auVar104._24_4_;
      auVar118._28_4_ = fVar252 + auVar104._28_4_;
      uVar90 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar202._4_4_ = uVar90;
      auVar202._0_4_ = uVar90;
      auVar202._8_4_ = uVar90;
      auVar202._12_4_ = uVar90;
      auVar202._16_4_ = uVar90;
      auVar202._20_4_ = uVar90;
      auVar202._24_4_ = uVar90;
      auVar202._28_4_ = uVar90;
      auVar25 = vcmpps_avx(auVar118,auVar202,2);
      auVar105 = vandps_avx(auVar25,*(undefined1 (*) [32])(auStack_180 + lVar89));
      _local_7a0 = auVar105;
      auVar25 = *(undefined1 (*) [32])(auStack_180 + lVar89) & auVar25;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') break;
      uVar84 = (ulong)(uVar91 - 1);
    }
    auVar171._8_4_ = 0x7f800000;
    auVar171._0_8_ = 0x7f8000007f800000;
    auVar171._12_4_ = 0x7f800000;
    auVar171._16_4_ = 0x7f800000;
    auVar171._20_4_ = 0x7f800000;
    auVar171._24_4_ = 0x7f800000;
    auVar171._28_4_ = 0x7f800000;
    auVar104 = vblendvps_avx(auVar171,auVar104,auVar105);
    auVar25 = vshufps_avx(auVar104,auVar104,0xb1);
    auVar25 = vminps_avx(auVar104,auVar25);
    auVar21 = vshufpd_avx(auVar25,auVar25,5);
    auVar25 = vminps_avx(auVar25,auVar21);
    auVar21 = vperm2f128_avx(auVar25,auVar25,1);
    auVar25 = vminps_avx(auVar25,auVar21);
    auVar104 = vcmpps_avx(auVar104,auVar25,0);
    auVar25 = auVar105 & auVar104;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar105 = vandps_avx(auVar104,auVar105);
    }
    auVar132._8_8_ = 0;
    auVar132._0_8_ = (&uStack_140)[uVar84 * 0xc];
    local_d24 = auStack_138[uVar84 * 0x18];
    uVar86 = vmovmskps_avx(auVar105);
    uVar82 = 0;
    if (uVar86 != 0) {
      for (; (uVar86 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
      }
    }
    *(undefined4 *)(local_7a0 + (ulong)uVar82 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar89) = _local_7a0;
    uVar86 = uVar91 - 1;
    if ((((((((_local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7a0 >> 0x7f,0) != '\0') ||
          (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7a0 >> 0xbf,0) != '\0') ||
        (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7a0[0x1f] < '\0') {
      uVar86 = uVar91;
    }
    auVar192 = vshufps_avx(auVar132,auVar132,0);
    auVar207 = vshufps_avx(auVar132,auVar132,0x55);
    auVar207 = vsubps_avx(auVar207,auVar192);
    local_460._4_4_ = auVar192._4_4_ + auVar207._4_4_ * 0.14285715;
    local_460._0_4_ = auVar192._0_4_ + auVar207._0_4_ * 0.0;
    fStack_458 = auVar192._8_4_ + auVar207._8_4_ * 0.2857143;
    fStack_454 = auVar192._12_4_ + auVar207._12_4_ * 0.42857146;
    fStack_450 = auVar192._0_4_ + auVar207._0_4_ * 0.5714286;
    fStack_44c = auVar192._4_4_ + auVar207._4_4_ * 0.71428573;
    fStack_448 = auVar192._8_4_ + auVar207._8_4_ * 0.8571429;
    fStack_444 = auVar192._12_4_ + auVar207._12_4_;
    local_7b0._8_8_ = 0;
    local_7b0._0_8_ = *(ulong *)(local_460 + (ulong)uVar82 * 4);
    uVar84 = (ulong)uVar86;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }